

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

bool embree::sse2::CurveNiIntersector1<4>::
     occluded_t<embree::sse2::SweepCurve1Intersector1<embree::CatmullRomCurveT>,embree::sse2::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  Primitive *pPVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  Primitive PVar8;
  Geometry *pGVar9;
  __int_type_conflict _Var10;
  long lVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined8 uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined6 uVar34;
  undefined1 auVar35 [12];
  undefined1 auVar36 [12];
  undefined1 auVar37 [12];
  undefined1 auVar38 [12];
  undefined1 auVar39 [12];
  undefined1 auVar40 [12];
  undefined1 auVar41 [12];
  undefined1 auVar42 [12];
  undefined1 auVar43 [12];
  undefined1 auVar44 [12];
  undefined1 auVar45 [12];
  undefined1 auVar46 [12];
  undefined1 auVar47 [12];
  undefined1 auVar48 [12];
  undefined1 auVar49 [12];
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar50;
  vfloat_impl<4> vVar51;
  int iVar52;
  undefined4 uVar53;
  undefined4 uVar54;
  StackEntry *pSVar55;
  ulong extraout_RAX;
  long extraout_RAX_00;
  long lVar56;
  RTCFilterFunctionN p_Var57;
  int iVar58;
  RayQueryContext *pRVar59;
  RayQueryContext *pRVar60;
  RayQueryContext *pRVar61;
  RayQueryContext *extraout_RDX;
  RayQueryContext *extraout_RDX_00;
  RayQueryContext *extraout_RDX_01;
  RayQueryContext *extraout_RDX_02;
  RayQueryContext *extraout_RDX_03;
  RayQueryContext *extraout_RDX_04;
  byte bVar62;
  ulong uVar63;
  ulong uVar64;
  ulong uVar65;
  RayQueryContext *pRVar66;
  bool bVar67;
  uint uVar68;
  uint uVar69;
  uint uVar70;
  uint uVar71;
  short sVar72;
  float fVar73;
  uint uVar74;
  float fVar118;
  float fVar120;
  __m128 a_1;
  undefined2 uVar117;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar79 [16];
  uint uVar119;
  uint uVar121;
  uint uVar122;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar86 [16];
  undefined1 auVar89 [16];
  undefined1 auVar92 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  float fVar123;
  float fVar142;
  float fVar143;
  vfloat4 v;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  float fVar144;
  float fVar156;
  float fVar157;
  float fVar158;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  float fVar159;
  float fVar160;
  float fVar171;
  float fVar172;
  vfloat4 v_1;
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  float fVar173;
  float fVar181;
  float fVar182;
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  float fVar183;
  float fVar210;
  float fVar212;
  undefined1 auVar184 [16];
  undefined1 auVar187 [16];
  undefined1 auVar190 [16];
  undefined1 auVar193 [16];
  undefined1 auVar196 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar203 [16];
  float fVar211;
  float fVar213;
  float fVar214;
  float fVar215;
  float fVar216;
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  float fVar217;
  float fVar227;
  float fVar228;
  vfloat4 a;
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  float fVar229;
  float fVar239;
  float fVar240;
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  float fVar241;
  float fVar243;
  float fVar254;
  float fVar257;
  undefined1 auVar244 [16];
  undefined1 auVar247 [16];
  float fVar242;
  float fVar255;
  float fVar258;
  float fVar260;
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  float fVar256;
  float fVar259;
  float fVar261;
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar252;
  undefined1 auVar253 [16];
  float fVar262;
  float fVar263;
  float fVar271;
  float fVar273;
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  float fVar272;
  float fVar274;
  float fVar275;
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  float fVar276;
  float fVar277;
  float fVar278;
  float fVar280;
  float fVar281;
  float fVar282;
  float fVar283;
  float fVar284;
  float fVar285;
  float fVar286;
  float fVar287;
  undefined1 auVar279 [16];
  float fVar288;
  float fVar289;
  float fVar294;
  float fVar297;
  float fVar300;
  undefined1 auVar290 [16];
  float fVar295;
  float fVar296;
  float fVar298;
  float fVar299;
  float fVar301;
  float fVar302;
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  float fVar303;
  float fVar304;
  float fVar310;
  float fVar312;
  float fVar314;
  undefined1 auVar305 [16];
  float fVar311;
  float fVar313;
  float fVar315;
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  float fVar316;
  float fVar317;
  float fVar319;
  float fVar320;
  float fVar321;
  float fVar322;
  float fVar323;
  undefined1 auVar318 [16];
  float fVar324;
  float fVar330;
  float fVar331;
  float fVar332;
  undefined1 auVar325 [16];
  undefined1 auVar327 [16];
  undefined1 auVar329 [16];
  float fVar333;
  float fVar334;
  float fVar335;
  float fVar336;
  float fVar337;
  float fVar338;
  float fVar339;
  float fVar340;
  float fVar341;
  float fVar342;
  float fVar343;
  float fVar344;
  float local_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float local_628;
  float fStack_624;
  float fStack_620;
  anon_union_4_3_4e909a83_for_anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1_3
  aStack_61c;
  uint local_60c;
  undefined1 local_5b8 [8];
  float fStack_5b0;
  float fStack_5ac;
  int local_53c;
  RTCFilterFunctionNArguments args;
  undefined1 local_508 [8];
  float fStack_500;
  float fStack_4fc;
  vfloatx vu0;
  uint local_4a8;
  uint uStack_4a4;
  uint uStack_4a0;
  uint uStack_49c;
  undefined1 local_388 [16];
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  undefined1 local_368 [8];
  float fStack_360;
  float fStack_35c;
  undefined1 local_358 [8];
  float fStack_350;
  float fStack_34c;
  float local_348;
  float fStack_344;
  float fStack_340;
  float fStack_33c;
  undefined1 local_338 [16];
  Primitive *local_328;
  ulong local_320;
  float local_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float local_308;
  float fStack_304;
  float fStack_300;
  float fStack_2fc;
  float local_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float local_2e8;
  float fStack_2e4;
  float fStack_2e0;
  float fStack_2dc;
  float local_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float local_2c8;
  float fStack_2c4;
  float fStack_2c0;
  float fStack_2bc;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float local_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  undefined1 local_258 [16];
  BBox<embree::vfloat_impl<4>_> tp1;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  BBox<embree::vfloat_impl<4>_> tp0;
  float local_118 [4];
  undefined1 local_108 [16];
  StackEntry stack [4];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 uVar116;
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar206 [16];
  undefined1 auVar236 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar326 [16];
  undefined1 auVar328 [16];
  
  PVar8 = prim[1];
  uVar65 = (ulong)(byte)PVar8;
  pPVar5 = prim + uVar65 * 0x19 + 6;
  fVar143 = *(float *)(pPVar5 + 0xc);
  fVar159 = ((ray->org).field_0.m128[0] - *(float *)pPVar5) * fVar143;
  fVar171 = ((ray->org).field_0.m128[1] - *(float *)(pPVar5 + 4)) * fVar143;
  fVar172 = ((ray->org).field_0.m128[2] - *(float *)(pPVar5 + 8)) * fVar143;
  fVar123 = fVar143 * (ray->dir).field_0.m128[0];
  fVar142 = fVar143 * (ray->dir).field_0.m128[1];
  fVar143 = fVar143 * (ray->dir).field_0.m128[2];
  uVar54 = *(undefined4 *)(prim + uVar65 * 4 + 6);
  uVar116 = (undefined1)((uint)uVar54 >> 0x18);
  uVar117 = CONCAT11(uVar116,uVar116);
  uVar116 = (undefined1)((uint)uVar54 >> 0x10);
  uVar18 = CONCAT35(CONCAT21(uVar117,uVar116),CONCAT14(uVar116,uVar54));
  uVar116 = (undefined1)((uint)uVar54 >> 8);
  uVar34 = CONCAT51(CONCAT41((int)((ulong)uVar18 >> 0x20),uVar116),uVar116);
  sVar72 = CONCAT11((char)uVar54,(char)uVar54);
  uVar64 = CONCAT62(uVar34,sVar72);
  auVar82._8_4_ = 0;
  auVar82._0_8_ = uVar64;
  auVar82._12_2_ = uVar117;
  auVar82._14_2_ = uVar117;
  uVar117 = (undefined2)((ulong)uVar18 >> 0x20);
  auVar265._12_4_ = auVar82._12_4_;
  auVar265._8_2_ = 0;
  auVar265._0_8_ = uVar64;
  auVar265._10_2_ = uVar117;
  auVar220._10_6_ = auVar265._10_6_;
  auVar220._8_2_ = uVar117;
  auVar220._0_8_ = uVar64;
  uVar117 = (undefined2)uVar34;
  auVar35._4_8_ = auVar220._8_8_;
  auVar35._2_2_ = uVar117;
  auVar35._0_2_ = uVar117;
  fVar144 = (float)((int)sVar72 >> 8);
  fVar156 = (float)(auVar35._0_4_ >> 0x18);
  fVar157 = (float)(auVar220._8_4_ >> 0x18);
  uVar54 = *(undefined4 *)(prim + uVar65 * 5 + 6);
  uVar116 = (undefined1)((uint)uVar54 >> 0x18);
  uVar117 = CONCAT11(uVar116,uVar116);
  uVar116 = (undefined1)((uint)uVar54 >> 0x10);
  uVar18 = CONCAT35(CONCAT21(uVar117,uVar116),CONCAT14(uVar116,uVar54));
  uVar116 = (undefined1)((uint)uVar54 >> 8);
  uVar34 = CONCAT51(CONCAT41((int)((ulong)uVar18 >> 0x20),uVar116),uVar116);
  sVar72 = CONCAT11((char)uVar54,(char)uVar54);
  uVar64 = CONCAT62(uVar34,sVar72);
  auVar221._8_4_ = 0;
  auVar221._0_8_ = uVar64;
  auVar221._12_2_ = uVar117;
  auVar221._14_2_ = uVar117;
  uVar117 = (undefined2)((ulong)uVar18 >> 0x20);
  auVar249._12_4_ = auVar221._12_4_;
  auVar249._8_2_ = 0;
  auVar249._0_8_ = uVar64;
  auVar249._10_2_ = uVar117;
  auVar75._10_6_ = auVar249._10_6_;
  auVar75._8_2_ = uVar117;
  auVar75._0_8_ = uVar64;
  uVar117 = (undefined2)uVar34;
  auVar36._4_8_ = auVar75._8_8_;
  auVar36._2_2_ = uVar117;
  auVar36._0_2_ = uVar117;
  fVar173 = (float)((int)sVar72 >> 8);
  fVar181 = (float)(auVar36._0_4_ >> 0x18);
  fVar182 = (float)(auVar75._8_4_ >> 0x18);
  uVar54 = *(undefined4 *)(prim + uVar65 * 6 + 6);
  uVar116 = (undefined1)((uint)uVar54 >> 0x18);
  uVar117 = CONCAT11(uVar116,uVar116);
  uVar116 = (undefined1)((uint)uVar54 >> 0x10);
  uVar18 = CONCAT35(CONCAT21(uVar117,uVar116),CONCAT14(uVar116,uVar54));
  uVar116 = (undefined1)((uint)uVar54 >> 8);
  uVar34 = CONCAT51(CONCAT41((int)((ulong)uVar18 >> 0x20),uVar116),uVar116);
  sVar72 = CONCAT11((char)uVar54,(char)uVar54);
  uVar64 = CONCAT62(uVar34,sVar72);
  auVar78._8_4_ = 0;
  auVar78._0_8_ = uVar64;
  auVar78._12_2_ = uVar117;
  auVar78._14_2_ = uVar117;
  uVar117 = (undefined2)((ulong)uVar18 >> 0x20);
  auVar77._12_4_ = auVar78._12_4_;
  auVar77._8_2_ = 0;
  auVar77._0_8_ = uVar64;
  auVar77._10_2_ = uVar117;
  auVar76._10_6_ = auVar77._10_6_;
  auVar76._8_2_ = uVar117;
  auVar76._0_8_ = uVar64;
  uVar117 = (undefined2)uVar34;
  auVar37._4_8_ = auVar76._8_8_;
  auVar37._2_2_ = uVar117;
  auVar37._0_2_ = uVar117;
  fVar229 = (float)((int)sVar72 >> 8);
  fVar239 = (float)(auVar37._0_4_ >> 0x18);
  fVar240 = (float)(auVar76._8_4_ >> 0x18);
  uVar54 = *(undefined4 *)(prim + uVar65 * 0xb + 6);
  uVar116 = (undefined1)((uint)uVar54 >> 0x18);
  uVar117 = CONCAT11(uVar116,uVar116);
  uVar116 = (undefined1)((uint)uVar54 >> 0x10);
  uVar18 = CONCAT35(CONCAT21(uVar117,uVar116),CONCAT14(uVar116,uVar54));
  uVar116 = (undefined1)((uint)uVar54 >> 8);
  uVar34 = CONCAT51(CONCAT41((int)((ulong)uVar18 >> 0x20),uVar116),uVar116);
  sVar72 = CONCAT11((char)uVar54,(char)uVar54);
  uVar64 = CONCAT62(uVar34,sVar72);
  auVar81._8_4_ = 0;
  auVar81._0_8_ = uVar64;
  auVar81._12_2_ = uVar117;
  auVar81._14_2_ = uVar117;
  uVar117 = (undefined2)((ulong)uVar18 >> 0x20);
  auVar80._12_4_ = auVar81._12_4_;
  auVar80._8_2_ = 0;
  auVar80._0_8_ = uVar64;
  auVar80._10_2_ = uVar117;
  auVar79._10_6_ = auVar80._10_6_;
  auVar79._8_2_ = uVar117;
  auVar79._0_8_ = uVar64;
  uVar117 = (undefined2)uVar34;
  auVar38._4_8_ = auVar79._8_8_;
  auVar38._2_2_ = uVar117;
  auVar38._0_2_ = uVar117;
  fVar73 = (float)((int)sVar72 >> 8);
  fVar118 = (float)(auVar38._0_4_ >> 0x18);
  fVar120 = (float)(auVar79._8_4_ >> 0x18);
  uVar54 = *(undefined4 *)(prim + uVar65 * 0xc + 6);
  uVar116 = (undefined1)((uint)uVar54 >> 0x18);
  uVar117 = CONCAT11(uVar116,uVar116);
  uVar116 = (undefined1)((uint)uVar54 >> 0x10);
  uVar18 = CONCAT35(CONCAT21(uVar117,uVar116),CONCAT14(uVar116,uVar54));
  uVar116 = (undefined1)((uint)uVar54 >> 8);
  uVar34 = CONCAT51(CONCAT41((int)((ulong)uVar18 >> 0x20),uVar116),uVar116);
  sVar72 = CONCAT11((char)uVar54,(char)uVar54);
  uVar64 = CONCAT62(uVar34,sVar72);
  auVar186._8_4_ = 0;
  auVar186._0_8_ = uVar64;
  auVar186._12_2_ = uVar117;
  auVar186._14_2_ = uVar117;
  uVar117 = (undefined2)((ulong)uVar18 >> 0x20);
  auVar185._12_4_ = auVar186._12_4_;
  auVar185._8_2_ = 0;
  auVar185._0_8_ = uVar64;
  auVar185._10_2_ = uVar117;
  auVar184._10_6_ = auVar185._10_6_;
  auVar184._8_2_ = uVar117;
  auVar184._0_8_ = uVar64;
  uVar117 = (undefined2)uVar34;
  auVar39._4_8_ = auVar184._8_8_;
  auVar39._2_2_ = uVar117;
  auVar39._0_2_ = uVar117;
  fVar217 = (float)((int)sVar72 >> 8);
  fVar227 = (float)(auVar39._0_4_ >> 0x18);
  fVar228 = (float)(auVar184._8_4_ >> 0x18);
  uVar54 = *(undefined4 *)(prim + uVar65 * 0xd + 6);
  uVar116 = (undefined1)((uint)uVar54 >> 0x18);
  uVar117 = CONCAT11(uVar116,uVar116);
  uVar116 = (undefined1)((uint)uVar54 >> 0x10);
  uVar18 = CONCAT35(CONCAT21(uVar117,uVar116),CONCAT14(uVar116,uVar54));
  uVar116 = (undefined1)((uint)uVar54 >> 8);
  uVar34 = CONCAT51(CONCAT41((int)((ulong)uVar18 >> 0x20),uVar116),uVar116);
  sVar72 = CONCAT11((char)uVar54,(char)uVar54);
  uVar64 = CONCAT62(uVar34,sVar72);
  auVar189._8_4_ = 0;
  auVar189._0_8_ = uVar64;
  auVar189._12_2_ = uVar117;
  auVar189._14_2_ = uVar117;
  uVar117 = (undefined2)((ulong)uVar18 >> 0x20);
  auVar188._12_4_ = auVar189._12_4_;
  auVar188._8_2_ = 0;
  auVar188._0_8_ = uVar64;
  auVar188._10_2_ = uVar117;
  auVar187._10_6_ = auVar188._10_6_;
  auVar187._8_2_ = uVar117;
  auVar187._0_8_ = uVar64;
  uVar117 = (undefined2)uVar34;
  auVar40._4_8_ = auVar187._8_8_;
  auVar40._2_2_ = uVar117;
  auVar40._0_2_ = uVar117;
  fVar262 = (float)((int)sVar72 >> 8);
  fVar271 = (float)(auVar40._0_4_ >> 0x18);
  fVar273 = (float)(auVar187._8_4_ >> 0x18);
  uVar54 = *(undefined4 *)(prim + uVar65 * 0x12 + 6);
  uVar116 = (undefined1)((uint)uVar54 >> 0x18);
  uVar117 = CONCAT11(uVar116,uVar116);
  uVar116 = (undefined1)((uint)uVar54 >> 0x10);
  uVar18 = CONCAT35(CONCAT21(uVar117,uVar116),CONCAT14(uVar116,uVar54));
  uVar116 = (undefined1)((uint)uVar54 >> 8);
  uVar34 = CONCAT51(CONCAT41((int)((ulong)uVar18 >> 0x20),uVar116),uVar116);
  sVar72 = CONCAT11((char)uVar54,(char)uVar54);
  uVar64 = CONCAT62(uVar34,sVar72);
  auVar192._8_4_ = 0;
  auVar192._0_8_ = uVar64;
  auVar192._12_2_ = uVar117;
  auVar192._14_2_ = uVar117;
  uVar117 = (undefined2)((ulong)uVar18 >> 0x20);
  auVar191._12_4_ = auVar192._12_4_;
  auVar191._8_2_ = 0;
  auVar191._0_8_ = uVar64;
  auVar191._10_2_ = uVar117;
  auVar190._10_6_ = auVar191._10_6_;
  auVar190._8_2_ = uVar117;
  auVar190._0_8_ = uVar64;
  uVar117 = (undefined2)uVar34;
  auVar41._4_8_ = auVar190._8_8_;
  auVar41._2_2_ = uVar117;
  auVar41._0_2_ = uVar117;
  fVar241 = (float)((int)sVar72 >> 8);
  fVar254 = (float)(auVar41._0_4_ >> 0x18);
  fVar257 = (float)(auVar190._8_4_ >> 0x18);
  uVar54 = *(undefined4 *)(prim + uVar65 * 0x13 + 6);
  uVar116 = (undefined1)((uint)uVar54 >> 0x18);
  uVar117 = CONCAT11(uVar116,uVar116);
  uVar116 = (undefined1)((uint)uVar54 >> 0x10);
  uVar18 = CONCAT35(CONCAT21(uVar117,uVar116),CONCAT14(uVar116,uVar54));
  uVar116 = (undefined1)((uint)uVar54 >> 8);
  uVar34 = CONCAT51(CONCAT41((int)((ulong)uVar18 >> 0x20),uVar116),uVar116);
  sVar72 = CONCAT11((char)uVar54,(char)uVar54);
  uVar64 = CONCAT62(uVar34,sVar72);
  auVar195._8_4_ = 0;
  auVar195._0_8_ = uVar64;
  auVar195._12_2_ = uVar117;
  auVar195._14_2_ = uVar117;
  uVar117 = (undefined2)((ulong)uVar18 >> 0x20);
  auVar194._12_4_ = auVar195._12_4_;
  auVar194._8_2_ = 0;
  auVar194._0_8_ = uVar64;
  auVar194._10_2_ = uVar117;
  auVar193._10_6_ = auVar194._10_6_;
  auVar193._8_2_ = uVar117;
  auVar193._0_8_ = uVar64;
  uVar117 = (undefined2)uVar34;
  auVar42._4_8_ = auVar193._8_8_;
  auVar42._2_2_ = uVar117;
  auVar42._0_2_ = uVar117;
  fVar276 = (float)((int)sVar72 >> 8);
  fVar280 = (float)(auVar42._0_4_ >> 0x18);
  fVar283 = (float)(auVar193._8_4_ >> 0x18);
  uVar54 = *(undefined4 *)(prim + uVar65 * 0x14 + 6);
  uVar116 = (undefined1)((uint)uVar54 >> 0x18);
  uVar117 = CONCAT11(uVar116,uVar116);
  uVar116 = (undefined1)((uint)uVar54 >> 0x10);
  uVar18 = CONCAT35(CONCAT21(uVar117,uVar116),CONCAT14(uVar116,uVar54));
  uVar116 = (undefined1)((uint)uVar54 >> 8);
  uVar34 = CONCAT51(CONCAT41((int)((ulong)uVar18 >> 0x20),uVar116),uVar116);
  sVar72 = CONCAT11((char)uVar54,(char)uVar54);
  uVar64 = CONCAT62(uVar34,sVar72);
  auVar198._8_4_ = 0;
  auVar198._0_8_ = uVar64;
  auVar198._12_2_ = uVar117;
  auVar198._14_2_ = uVar117;
  uVar117 = (undefined2)((ulong)uVar18 >> 0x20);
  auVar197._12_4_ = auVar198._12_4_;
  auVar197._8_2_ = 0;
  auVar197._0_8_ = uVar64;
  auVar197._10_2_ = uVar117;
  auVar196._10_6_ = auVar197._10_6_;
  auVar196._8_2_ = uVar117;
  auVar196._0_8_ = uVar64;
  uVar117 = (undefined2)uVar34;
  auVar43._4_8_ = auVar196._8_8_;
  auVar43._2_2_ = uVar117;
  auVar43._0_2_ = uVar117;
  fVar316 = (float)((int)sVar72 >> 8);
  fVar319 = (float)(auVar43._0_4_ >> 0x18);
  fVar321 = (float)(auVar196._8_4_ >> 0x18);
  fVar303 = fVar123 * fVar144 + fVar142 * fVar173 + fVar143 * fVar229;
  fVar310 = fVar123 * fVar156 + fVar142 * fVar181 + fVar143 * fVar239;
  fVar312 = fVar123 * fVar157 + fVar142 * fVar182 + fVar143 * fVar240;
  fVar314 = fVar123 * (float)(auVar265._12_4_ >> 0x18) +
            fVar142 * (float)(auVar249._12_4_ >> 0x18) + fVar143 * (float)(auVar77._12_4_ >> 0x18);
  fVar288 = fVar123 * fVar73 + fVar142 * fVar217 + fVar143 * fVar262;
  fVar294 = fVar123 * fVar118 + fVar142 * fVar227 + fVar143 * fVar271;
  fVar297 = fVar123 * fVar120 + fVar142 * fVar228 + fVar143 * fVar273;
  fVar300 = fVar123 * (float)(auVar80._12_4_ >> 0x18) +
            fVar142 * (float)(auVar185._12_4_ >> 0x18) + fVar143 * (float)(auVar188._12_4_ >> 0x18);
  fVar183 = fVar123 * fVar241 + fVar142 * fVar276 + fVar143 * fVar316;
  fVar210 = fVar123 * fVar254 + fVar142 * fVar280 + fVar143 * fVar319;
  fVar212 = fVar123 * fVar257 + fVar142 * fVar283 + fVar143 * fVar321;
  fVar143 = fVar123 * (float)(auVar191._12_4_ >> 0x18) +
            fVar142 * (float)(auVar194._12_4_ >> 0x18) + fVar143 * (float)(auVar197._12_4_ >> 0x18);
  fVar229 = fVar144 * fVar159 + fVar173 * fVar171 + fVar229 * fVar172;
  fVar239 = fVar156 * fVar159 + fVar181 * fVar171 + fVar239 * fVar172;
  fVar240 = fVar157 * fVar159 + fVar182 * fVar171 + fVar240 * fVar172;
  fVar158 = (float)(auVar265._12_4_ >> 0x18) * fVar159 +
            (float)(auVar249._12_4_ >> 0x18) * fVar171 + (float)(auVar77._12_4_ >> 0x18) * fVar172;
  fVar262 = fVar73 * fVar159 + fVar217 * fVar171 + fVar262 * fVar172;
  fVar227 = fVar118 * fVar159 + fVar227 * fVar171 + fVar271 * fVar172;
  fVar228 = fVar120 * fVar159 + fVar228 * fVar171 + fVar273 * fVar172;
  fVar271 = (float)(auVar80._12_4_ >> 0x18) * fVar159 +
            (float)(auVar185._12_4_ >> 0x18) * fVar171 + (float)(auVar188._12_4_ >> 0x18) * fVar172;
  fVar173 = fVar159 * fVar241 + fVar171 * fVar276 + fVar172 * fVar316;
  fVar181 = fVar159 * fVar254 + fVar171 * fVar280 + fVar172 * fVar319;
  fVar182 = fVar159 * fVar257 + fVar171 * fVar283 + fVar172 * fVar321;
  fVar217 = fVar159 * (float)(auVar191._12_4_ >> 0x18) +
            fVar171 * (float)(auVar194._12_4_ >> 0x18) + fVar172 * (float)(auVar197._12_4_ >> 0x18);
  uVar74 = (uint)DAT_01f46710;
  uVar119 = DAT_01f46710._4_4_;
  uVar121 = DAT_01f46710._8_4_;
  uVar122 = DAT_01f46710._12_4_;
  uVar68 = -(uint)(1e-18 <= (float)((uint)fVar303 & uVar74));
  uVar69 = -(uint)(1e-18 <= (float)((uint)fVar310 & uVar119));
  uVar70 = -(uint)(1e-18 <= (float)((uint)fVar312 & uVar121));
  uVar71 = -(uint)(1e-18 <= (float)((uint)fVar314 & uVar122));
  auVar305._0_4_ = (uint)fVar303 & uVar68;
  auVar305._4_4_ = (uint)fVar310 & uVar69;
  auVar305._8_4_ = (uint)fVar312 & uVar70;
  auVar305._12_4_ = (uint)fVar314 & uVar71;
  auVar161._0_8_ = CONCAT44(~uVar69,~uVar68) & 0x219392ef219392ef;
  auVar161._8_4_ = ~uVar70 & 0x219392ef;
  auVar161._12_4_ = ~uVar71 & 0x219392ef;
  auVar161 = auVar161 | auVar305;
  uVar68 = -(uint)(1e-18 <= (float)((uint)fVar288 & uVar74));
  uVar69 = -(uint)(1e-18 <= (float)((uint)fVar294 & uVar119));
  uVar70 = -(uint)(1e-18 <= (float)((uint)fVar297 & uVar121));
  uVar71 = -(uint)(1e-18 <= (float)((uint)fVar300 & uVar122));
  auVar290._0_4_ = (uint)fVar288 & uVar68;
  auVar290._4_4_ = (uint)fVar294 & uVar69;
  auVar290._8_4_ = (uint)fVar297 & uVar70;
  auVar290._12_4_ = (uint)fVar300 & uVar71;
  auVar174._0_8_ = CONCAT44(~uVar69,~uVar68) & 0x219392ef219392ef;
  auVar174._8_4_ = ~uVar70 & 0x219392ef;
  auVar174._12_4_ = ~uVar71 & 0x219392ef;
  auVar174 = auVar174 | auVar290;
  uVar68 = -(uint)(1e-18 <= (float)((uint)fVar183 & uVar74));
  uVar69 = -(uint)(1e-18 <= (float)((uint)fVar210 & uVar119));
  uVar70 = -(uint)(1e-18 <= (float)((uint)fVar212 & uVar121));
  uVar71 = -(uint)(1e-18 <= (float)((uint)fVar143 & uVar122));
  auVar199._0_4_ = (uint)fVar183 & uVar68;
  auVar199._4_4_ = (uint)fVar210 & uVar69;
  auVar199._8_4_ = (uint)fVar212 & uVar70;
  auVar199._12_4_ = (uint)fVar143 & uVar71;
  auVar218._0_8_ = CONCAT44(~uVar69,~uVar68) & 0x219392ef219392ef;
  auVar218._8_4_ = ~uVar70 & 0x219392ef;
  auVar218._12_4_ = ~uVar71 & 0x219392ef;
  auVar218 = auVar218 | auVar199;
  auVar82 = rcpps(_DAT_01f46710,auVar161);
  fVar143 = auVar82._0_4_;
  fVar120 = auVar82._4_4_;
  fVar144 = auVar82._8_4_;
  fVar159 = auVar82._12_4_;
  fVar143 = (1.0 - auVar161._0_4_ * fVar143) * fVar143 + fVar143;
  fVar120 = (1.0 - auVar161._4_4_ * fVar120) * fVar120 + fVar120;
  fVar144 = (1.0 - auVar161._8_4_ * fVar144) * fVar144 + fVar144;
  fVar159 = (1.0 - auVar161._12_4_ * fVar159) * fVar159 + fVar159;
  auVar82 = rcpps(auVar82,auVar174);
  fVar73 = auVar82._0_4_;
  fVar123 = auVar82._4_4_;
  fVar156 = auVar82._8_4_;
  fVar171 = auVar82._12_4_;
  fVar73 = (1.0 - auVar174._0_4_ * fVar73) * fVar73 + fVar73;
  fVar123 = (1.0 - auVar174._4_4_ * fVar123) * fVar123 + fVar123;
  fVar156 = (1.0 - auVar174._8_4_ * fVar156) * fVar156 + fVar156;
  fVar171 = (1.0 - auVar174._12_4_ * fVar171) * fVar171 + fVar171;
  auVar82 = rcpps(auVar82,auVar218);
  fVar118 = auVar82._0_4_;
  fVar142 = auVar82._4_4_;
  fVar157 = auVar82._8_4_;
  fVar172 = auVar82._12_4_;
  fVar118 = (1.0 - auVar218._0_4_ * fVar118) * fVar118 + fVar118;
  fVar142 = (1.0 - auVar218._4_4_ * fVar142) * fVar142 + fVar142;
  fVar157 = (1.0 - auVar218._8_4_ * fVar157) * fVar157 + fVar157;
  fVar172 = (1.0 - auVar218._12_4_ * fVar172) * fVar172 + fVar172;
  uVar64 = *(ulong *)(prim + uVar65 * 7 + 6);
  uVar117 = (undefined2)(uVar64 >> 0x30);
  auVar85._8_4_ = 0;
  auVar85._0_8_ = uVar64;
  auVar85._12_2_ = uVar117;
  auVar85._14_2_ = uVar117;
  uVar117 = (undefined2)(uVar64 >> 0x20);
  auVar84._12_4_ = auVar85._12_4_;
  auVar84._8_2_ = 0;
  auVar84._0_8_ = uVar64;
  auVar84._10_2_ = uVar117;
  auVar83._10_6_ = auVar84._10_6_;
  auVar83._8_2_ = uVar117;
  auVar83._0_8_ = uVar64;
  uVar117 = (undefined2)(uVar64 >> 0x10);
  auVar44._4_8_ = auVar83._8_8_;
  auVar44._2_2_ = uVar117;
  auVar44._0_2_ = uVar117;
  auVar162._0_8_ =
       CONCAT44(((float)(auVar44._0_4_ >> 0x10) - fVar239) * fVar120,
                ((float)(int)(short)uVar64 - fVar229) * fVar143);
  auVar162._8_4_ = ((float)(auVar83._8_4_ >> 0x10) - fVar240) * fVar144;
  auVar162._12_4_ = ((float)(auVar84._12_4_ >> 0x10) - fVar158) * fVar159;
  uVar64 = *(ulong *)(prim + uVar65 * 9 + 6);
  uVar117 = (undefined2)(uVar64 >> 0x30);
  auVar88._8_4_ = 0;
  auVar88._0_8_ = uVar64;
  auVar88._12_2_ = uVar117;
  auVar88._14_2_ = uVar117;
  uVar117 = (undefined2)(uVar64 >> 0x20);
  auVar87._12_4_ = auVar88._12_4_;
  auVar87._8_2_ = 0;
  auVar87._0_8_ = uVar64;
  auVar87._10_2_ = uVar117;
  auVar86._10_6_ = auVar87._10_6_;
  auVar86._8_2_ = uVar117;
  auVar86._0_8_ = uVar64;
  uVar117 = (undefined2)(uVar64 >> 0x10);
  auVar45._4_8_ = auVar86._8_8_;
  auVar45._2_2_ = uVar117;
  auVar45._0_2_ = uVar117;
  auVar219._0_4_ = ((float)(int)(short)uVar64 - fVar229) * fVar143;
  auVar219._4_4_ = ((float)(auVar45._0_4_ >> 0x10) - fVar239) * fVar120;
  auVar219._8_4_ = ((float)(auVar86._8_4_ >> 0x10) - fVar240) * fVar144;
  auVar219._12_4_ = ((float)(auVar87._12_4_ >> 0x10) - fVar158) * fVar159;
  uVar64 = *(ulong *)(prim + uVar65 * 0xe + 6);
  uVar117 = (undefined2)(uVar64 >> 0x30);
  auVar91._8_4_ = 0;
  auVar91._0_8_ = uVar64;
  auVar91._12_2_ = uVar117;
  auVar91._14_2_ = uVar117;
  uVar117 = (undefined2)(uVar64 >> 0x20);
  auVar90._12_4_ = auVar91._12_4_;
  auVar90._8_2_ = 0;
  auVar90._0_8_ = uVar64;
  auVar90._10_2_ = uVar117;
  auVar89._10_6_ = auVar90._10_6_;
  auVar89._8_2_ = uVar117;
  auVar89._0_8_ = uVar64;
  uVar117 = (undefined2)(uVar64 >> 0x10);
  auVar46._4_8_ = auVar89._8_8_;
  auVar46._2_2_ = uVar117;
  auVar46._0_2_ = uVar117;
  auVar145._0_8_ =
       CONCAT44(((float)(auVar46._0_4_ >> 0x10) - fVar227) * fVar123,
                ((float)(int)(short)uVar64 - fVar262) * fVar73);
  auVar145._8_4_ = ((float)(auVar89._8_4_ >> 0x10) - fVar228) * fVar156;
  auVar145._12_4_ = ((float)(auVar90._12_4_ >> 0x10) - fVar271) * fVar171;
  uVar64 = *(ulong *)(prim + (ulong)(byte)PVar8 * 0x10 + 6);
  uVar117 = (undefined2)(uVar64 >> 0x30);
  auVar94._8_4_ = 0;
  auVar94._0_8_ = uVar64;
  auVar94._12_2_ = uVar117;
  auVar94._14_2_ = uVar117;
  uVar117 = (undefined2)(uVar64 >> 0x20);
  auVar93._12_4_ = auVar94._12_4_;
  auVar93._8_2_ = 0;
  auVar93._0_8_ = uVar64;
  auVar93._10_2_ = uVar117;
  auVar92._10_6_ = auVar93._10_6_;
  auVar92._8_2_ = uVar117;
  auVar92._0_8_ = uVar64;
  uVar117 = (undefined2)(uVar64 >> 0x10);
  auVar47._4_8_ = auVar92._8_8_;
  auVar47._2_2_ = uVar117;
  auVar47._0_2_ = uVar117;
  auVar95._0_4_ = ((float)(int)(short)uVar64 - fVar262) * fVar73;
  auVar95._4_4_ = ((float)(auVar47._0_4_ >> 0x10) - fVar227) * fVar123;
  auVar95._8_4_ = ((float)(auVar92._8_4_ >> 0x10) - fVar228) * fVar156;
  auVar95._12_4_ = ((float)(auVar93._12_4_ >> 0x10) - fVar271) * fVar171;
  uVar64 = *(ulong *)(prim + uVar65 * 0x15 + 6);
  uVar117 = (undefined2)(uVar64 >> 0x30);
  auVar202._8_4_ = 0;
  auVar202._0_8_ = uVar64;
  auVar202._12_2_ = uVar117;
  auVar202._14_2_ = uVar117;
  uVar117 = (undefined2)(uVar64 >> 0x20);
  auVar201._12_4_ = auVar202._12_4_;
  auVar201._8_2_ = 0;
  auVar201._0_8_ = uVar64;
  auVar201._10_2_ = uVar117;
  auVar200._10_6_ = auVar201._10_6_;
  auVar200._8_2_ = uVar117;
  auVar200._0_8_ = uVar64;
  uVar117 = (undefined2)(uVar64 >> 0x10);
  auVar48._4_8_ = auVar200._8_8_;
  auVar48._2_2_ = uVar117;
  auVar48._0_2_ = uVar117;
  auVar203._0_8_ =
       CONCAT44(((float)(auVar48._0_4_ >> 0x10) - fVar181) * fVar142,
                ((float)(int)(short)uVar64 - fVar173) * fVar118);
  auVar203._8_4_ = ((float)(auVar200._8_4_ >> 0x10) - fVar182) * fVar157;
  auVar203._12_4_ = ((float)(auVar201._12_4_ >> 0x10) - fVar217) * fVar172;
  uVar64 = *(ulong *)(prim + uVar65 * 0x17 + 6);
  uVar117 = (undefined2)(uVar64 >> 0x30);
  auVar246._8_4_ = 0;
  auVar246._0_8_ = uVar64;
  auVar246._12_2_ = uVar117;
  auVar246._14_2_ = uVar117;
  uVar117 = (undefined2)(uVar64 >> 0x20);
  auVar245._12_4_ = auVar246._12_4_;
  auVar245._8_2_ = 0;
  auVar245._0_8_ = uVar64;
  auVar245._10_2_ = uVar117;
  auVar244._10_6_ = auVar245._10_6_;
  auVar244._8_2_ = uVar117;
  auVar244._0_8_ = uVar64;
  uVar117 = (undefined2)(uVar64 >> 0x10);
  auVar49._4_8_ = auVar244._8_8_;
  auVar49._2_2_ = uVar117;
  auVar49._0_2_ = uVar117;
  auVar247._0_4_ = ((float)(int)(short)uVar64 - fVar173) * fVar118;
  auVar247._4_4_ = ((float)(auVar49._0_4_ >> 0x10) - fVar181) * fVar142;
  auVar247._8_4_ = ((float)(auVar244._8_4_ >> 0x10) - fVar182) * fVar157;
  auVar247._12_4_ = ((float)(auVar245._12_4_ >> 0x10) - fVar217) * fVar172;
  auVar264._8_4_ = auVar162._8_4_;
  auVar264._0_8_ = auVar162._0_8_;
  auVar264._12_4_ = auVar162._12_4_;
  auVar265 = minps(auVar264,auVar219);
  auVar124._8_4_ = auVar145._8_4_;
  auVar124._0_8_ = auVar145._0_8_;
  auVar124._12_4_ = auVar145._12_4_;
  auVar82 = minps(auVar124,auVar95);
  auVar265 = maxps(auVar265,auVar82);
  auVar125._8_4_ = auVar203._8_4_;
  auVar125._0_8_ = auVar203._0_8_;
  auVar125._12_4_ = auVar203._12_4_;
  auVar82 = minps(auVar125,auVar247);
  uVar54 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar175._4_4_ = uVar54;
  auVar175._0_4_ = uVar54;
  auVar175._8_4_ = uVar54;
  auVar175._12_4_ = uVar54;
  auVar82 = maxps(auVar82,auVar175);
  auVar82 = maxps(auVar265,auVar82);
  fVar73 = auVar82._0_4_ * 0.99999964;
  fVar118 = auVar82._4_4_ * 0.99999964;
  fVar120 = auVar82._8_4_ * 0.99999964;
  fVar123 = auVar82._12_4_ * 0.99999964;
  auVar265 = maxps(auVar162,auVar219);
  auVar82 = maxps(auVar145,auVar95);
  auVar82 = minps(auVar265,auVar82);
  auVar265 = maxps(auVar203,auVar247);
  fVar143 = ray->tfar;
  auVar96._4_4_ = fVar143;
  auVar96._0_4_ = fVar143;
  auVar96._8_4_ = fVar143;
  auVar96._12_4_ = fVar143;
  auVar265 = minps(auVar265,auVar96);
  auVar82 = minps(auVar82,auVar265);
  auVar126._0_4_ = -(uint)(PVar8 != (Primitive)0x0 && fVar73 <= auVar82._0_4_ * 1.0000004);
  auVar126._4_4_ = -(uint)(1 < (byte)PVar8 && fVar118 <= auVar82._4_4_ * 1.0000004);
  auVar126._8_4_ = -(uint)(2 < (byte)PVar8 && fVar120 <= auVar82._8_4_ * 1.0000004);
  auVar126._12_4_ = -(uint)(3 < (byte)PVar8 && fVar123 <= auVar82._12_4_ * 1.0000004);
  uVar68 = movmskps((int)(uVar65 * 0x15),auVar126);
  auVar127._0_12_ = mm_lookupmask_ps._240_12_;
  auVar127._12_4_ = 0;
  local_328 = prim;
LAB_002f7890:
  local_320 = (ulong)uVar68;
  if (local_320 == 0) {
LAB_002fa140:
    return local_320 != 0;
  }
  lVar56 = 0;
  if (local_320 != 0) {
    for (; (uVar68 >> lVar56 & 1) == 0; lVar56 = lVar56 + 1) {
    }
  }
  uVar65 = local_320 - 1 & local_320;
  pRVar59 = (RayQueryContext *)(ulong)*(uint *)(local_328 + 2);
  pGVar9 = (context->scene->geometries).items[(long)pRVar59].ptr;
  _Var10 = pGVar9[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  uVar64 = (ulong)*(uint *)(*(long *)&pGVar9->field_0x58 +
                           _Var10 * *(uint *)(local_328 + lVar56 * 4 + 6));
  pRVar61 = (RayQueryContext *)pGVar9[1].intersectionFilterN;
  lVar56 = *(long *)&pGVar9[1].time_range.upper;
  pfVar1 = (float *)(lVar56 + (long)pRVar61 * uVar64);
  pfVar2 = (float *)(lVar56 + (uVar64 + 1) * (long)pRVar61);
  pfVar3 = (float *)(lVar56 + (uVar64 + 2) * (long)pRVar61);
  lVar11 = 0;
  if (uVar65 != 0) {
    for (; (uVar65 >> lVar11 & 1) == 0; lVar11 = lVar11 + 1) {
    }
  }
  pfVar4 = (float *)(lVar56 + (uVar64 + 3) * (long)pRVar61);
  if ((uVar65 != 0) && (uVar64 = uVar65 - 1 & uVar65, uVar64 != 0)) {
    lVar56 = 0;
    if (uVar64 != 0) {
      for (; (uVar64 >> lVar56 & 1) == 0; lVar56 = lVar56 + 1) {
      }
    }
    pRVar61 = (RayQueryContext *)
              ((long)pRVar61 *
              (ulong)*(uint *)(*(long *)&pGVar9->field_0x58 +
                              _Var10 * *(uint *)(local_328 + lVar56 * 4 + 6)));
  }
  fVar143 = (ray->org).field_0.m128[0];
  fVar142 = (ray->org).field_0.m128[1];
  fVar144 = (ray->org).field_0.m128[2];
  local_348 = (ray->dir).field_0.m128[0];
  fVar156 = (ray->dir).field_0.m128[1];
  fVar157 = (ray->dir).field_0.m128[2];
  fVar159 = (ray->dir).field_0.m128[3];
  fVar173 = local_348 * local_348;
  fVar182 = fVar156 * fVar156;
  fVar229 = fVar157 * fVar157;
  fVar159 = fVar159 * fVar159;
  fVar171 = fVar173 + fVar182 + fVar229;
  auVar176._0_8_ = CONCAT44(fVar182 + fVar182 + fVar159,fVar171);
  auVar176._8_4_ = fVar229 + fVar182 + fVar229;
  auVar176._12_4_ = fVar159 + fVar182 + fVar159;
  auVar163._8_4_ = auVar176._8_4_;
  auVar163._0_8_ = auVar176._0_8_;
  auVar163._12_4_ = auVar176._12_4_;
  auVar82 = rcpss(auVar163,auVar176);
  fVar172 = (2.0 - fVar171 * auVar82._0_4_) * auVar82._0_4_ *
            (((pfVar1[2] + pfVar2[2]) * 0.5 - fVar144) * fVar157 +
            ((pfVar1[1] + pfVar2[1]) * 0.5 - fVar142) * fVar156 +
            ((*pfVar1 + *pfVar2) * 0.5 - fVar143) * local_348);
  local_338 = ZEXT416((uint)fVar172);
  fVar143 = local_348 * fVar172 + fVar143;
  fVar142 = fVar156 * fVar172 + fVar142;
  fVar144 = fVar157 * fVar172 + fVar144;
  fVar240 = *pfVar1 - fVar143;
  fVar158 = pfVar1[1] - fVar142;
  fVar183 = pfVar1[2] - fVar144;
  fVar210 = pfVar1[3] - 0.0;
  fVar254 = *pfVar3 - fVar143;
  fVar257 = pfVar3[1] - fVar142;
  fVar262 = pfVar3[2] - fVar144;
  fVar271 = pfVar3[3] - 0.0;
  fVar212 = *pfVar2 - fVar143;
  fVar227 = pfVar2[1] - fVar142;
  fVar228 = pfVar2[2] - fVar144;
  fVar241 = pfVar2[3] - 0.0;
  fVar143 = *pfVar4 - fVar143;
  fVar142 = pfVar4[1] - fVar142;
  fVar144 = pfVar4[2] - fVar144;
  fVar273 = pfVar4[3] - 0.0;
  local_268 = fVar240;
  fStack_264 = fVar240;
  fStack_260 = fVar240;
  fStack_25c = fVar240;
  local_278 = fVar183;
  fStack_274 = fVar183;
  fStack_270 = fVar183;
  fStack_26c = fVar183;
  local_288 = fVar212;
  fStack_284 = fVar212;
  fStack_280 = fVar212;
  fStack_27c = fVar212;
  local_298 = fVar227;
  fStack_294 = fVar227;
  fStack_290 = fVar227;
  fStack_28c = fVar227;
  local_2a8 = fVar228;
  fStack_2a4 = fVar228;
  fStack_2a0 = fVar228;
  fStack_29c = fVar228;
  local_2b8 = fVar241;
  fStack_2b4 = fVar241;
  fStack_2b0 = fVar241;
  fStack_2ac = fVar241;
  fVar181 = fVar173 + fVar229 + fVar182;
  fVar217 = fVar173 + fVar229 + fVar182;
  fVar239 = fVar173 + fVar229 + fVar182;
  fVar173 = fVar173 + fVar229 + fVar182;
  local_2c8 = fVar271;
  fStack_2c4 = fVar271;
  fStack_2c0 = fVar271;
  fStack_2bc = fVar271;
  local_2d8 = fVar142;
  fStack_2d4 = fVar142;
  fStack_2d0 = fVar142;
  fStack_2cc = fVar142;
  local_2e8 = fVar144;
  fStack_2e4 = fVar144;
  fStack_2e0 = fVar144;
  fStack_2dc = fVar144;
  local_2f8 = fVar273;
  fStack_2f4 = fVar273;
  fStack_2f0 = fVar273;
  fStack_2ec = fVar273;
  fStack_344 = local_348;
  fStack_340 = local_348;
  fStack_33c = local_348;
  local_318 = ABS(fVar181);
  fStack_314 = ABS(fVar217);
  fStack_310 = ABS(fVar239);
  fStack_30c = ABS(fVar173);
  bVar62 = 0;
  pSVar55 = (StackEntry *)0x1;
  local_60c = 1;
  fVar159 = 0.0;
  fVar171 = 1.0;
  local_308 = fVar143;
  fStack_304 = fVar143;
  fStack_300 = fVar143;
  fStack_2fc = fVar143;
  pRVar60 = (RayQueryContext *)0x0;
  do {
    fVar160 = fVar171 - fVar159;
    fVar303 = fVar160 * 0.0 + fVar159;
    fVar310 = fVar160 * 0.33333334 + fVar159;
    fVar312 = fVar160 * 0.6666667 + fVar159;
    fVar314 = fVar160 * 1.0 + fVar159;
    fVar242 = 1.0 - fVar303;
    fVar255 = 1.0 - fVar310;
    fVar258 = 1.0 - fVar312;
    fVar260 = 1.0 - fVar314;
    fVar182 = fVar303 * 3.0;
    fVar276 = fVar310 * 3.0;
    fVar283 = fVar312 * 3.0;
    fVar294 = fVar314 * 3.0;
    fVar263 = ((fVar242 * 3.0 + -5.0) * fVar242 * fVar242 + 2.0) * 0.5;
    fVar272 = ((fVar255 * 3.0 + -5.0) * fVar255 * fVar255 + 2.0) * 0.5;
    fVar274 = ((fVar258 * 3.0 + -5.0) * fVar258 * fVar258 + 2.0) * 0.5;
    fVar275 = ((fVar260 * 3.0 + -5.0) * fVar260 * fVar260 + 2.0) * 0.5;
    fVar316 = -fVar242 * fVar303 * fVar303 * 0.5;
    fVar321 = -fVar255 * fVar310 * fVar310 * 0.5;
    fVar213 = -fVar258 * fVar312 * fVar312 * 0.5;
    fVar215 = -fVar260 * fVar314 * fVar314 * 0.5;
    fVar277 = (fVar303 * fVar303 * (fVar182 + -5.0) + 2.0) * 0.5;
    fVar281 = (fVar310 * fVar310 * (fVar276 + -5.0) + 2.0) * 0.5;
    fVar284 = (fVar312 * fVar312 * (fVar283 + -5.0) + 2.0) * 0.5;
    fVar286 = (fVar314 * fVar314 * (fVar294 + -5.0) + 2.0) * 0.5;
    fVar300 = fVar160 * 0.11111111;
    fVar319 = -fVar303 * fVar242 * fVar242 * 0.5;
    fVar211 = -fVar310 * fVar255 * fVar255 * 0.5;
    fVar214 = -fVar312 * fVar258 * fVar258 * 0.5;
    fVar216 = -fVar314 * fVar260 * fVar260 * 0.5;
    fVar333 = local_268 * fVar319 + local_288 * fVar277 + fVar254 * fVar263 + local_308 * fVar316;
    fVar336 = fStack_264 * fVar211 + fStack_284 * fVar281 + fVar254 * fVar272 + fStack_304 * fVar321
    ;
    fVar339 = fStack_260 * fVar214 + fStack_280 * fVar284 + fVar254 * fVar274 + fStack_300 * fVar213
    ;
    fVar342 = fStack_25c * fVar216 + fStack_27c * fVar286 + fVar254 * fVar275 + fStack_2fc * fVar215
    ;
    fVar229 = fVar158 * fVar319 + local_298 * fVar277 + fVar257 * fVar263 + local_2d8 * fVar316;
    fVar280 = fVar158 * fVar211 + fStack_294 * fVar281 + fVar257 * fVar272 + fStack_2d4 * fVar321;
    fVar288 = fVar158 * fVar214 + fStack_290 * fVar284 + fVar257 * fVar274 + fStack_2d0 * fVar213;
    fVar297 = fVar158 * fVar216 + fStack_28c * fVar286 + fVar257 * fVar275 + fStack_2cc * fVar215;
    fVar304 = local_278 * fVar319 + local_2a8 * fVar277 + fVar262 * fVar263 + local_2e8 * fVar316;
    fVar311 = fStack_274 * fVar211 + fStack_2a4 * fVar281 + fVar262 * fVar272 + fStack_2e4 * fVar321
    ;
    fVar313 = fStack_270 * fVar214 + fStack_2a0 * fVar284 + fVar262 * fVar274 + fStack_2e0 * fVar213
    ;
    fVar315 = fStack_26c * fVar216 + fStack_29c * fVar286 + fVar262 * fVar275 + fStack_2dc * fVar215
    ;
    fVar263 = fVar319 * fVar210 + fVar277 * local_2b8 + fVar263 * local_2c8 + fVar316 * local_2f8;
    fVar272 = fVar211 * fVar210 + fVar281 * fStack_2b4 + fVar272 * fStack_2c4 + fVar321 * fStack_2f4
    ;
    fVar274 = fVar214 * fVar210 + fVar284 * fStack_2b0 + fVar274 * fStack_2c0 + fVar213 * fStack_2f0
    ;
    fVar275 = fVar216 * fVar210 + fVar286 * fStack_2ac + fVar275 * fStack_2bc + fVar215 * fStack_2ec
    ;
    fVar213 = fVar303 * (fVar242 + fVar242);
    fVar215 = fVar310 * (fVar255 + fVar255);
    fVar216 = fVar312 * (fVar258 + fVar258);
    fVar284 = fVar314 * (fVar260 + fVar260);
    fVar214 = (fVar213 - fVar242 * fVar242) * 0.5;
    fVar277 = (fVar215 - fVar255 * fVar255) * 0.5;
    fVar281 = (fVar216 - fVar258 * fVar258) * 0.5;
    fVar286 = (fVar284 - fVar260 * fVar260) * 0.5;
    fVar316 = (fVar303 * fVar182 + (fVar303 + fVar303) * (fVar182 + -5.0)) * 0.5;
    fVar319 = (fVar310 * fVar276 + (fVar310 + fVar310) * (fVar276 + -5.0)) * 0.5;
    fVar321 = (fVar312 * fVar283 + (fVar312 + fVar312) * (fVar283 + -5.0)) * 0.5;
    fVar211 = (fVar314 * fVar294 + (fVar314 + fVar314) * (fVar294 + -5.0)) * 0.5;
    fVar182 = ((fVar182 + 2.0) * (fVar242 + fVar242) - fVar242 * 3.0 * fVar242) * 0.5;
    fVar276 = ((fVar276 + 2.0) * (fVar255 + fVar255) - fVar255 * 3.0 * fVar255) * 0.5;
    fVar283 = ((fVar283 + 2.0) * (fVar258 + fVar258) - fVar258 * 3.0 * fVar258) * 0.5;
    fVar294 = ((fVar294 + 2.0) * (fVar260 + fVar260) - fVar260 * 3.0 * fVar260) * 0.5;
    fVar303 = (fVar303 * fVar303 - fVar213) * 0.5;
    fVar310 = (fVar310 * fVar310 - fVar215) * 0.5;
    fVar312 = (fVar312 * fVar312 - fVar216) * 0.5;
    fVar314 = (fVar314 * fVar314 - fVar284) * 0.5;
    fVar216 = (local_268 * fVar214 + local_288 * fVar316 + fVar254 * fVar182 + local_308 * fVar303)
              * fVar300;
    fVar242 = (fStack_264 * fVar277 +
              fStack_284 * fVar319 + fVar254 * fVar276 + fStack_304 * fVar310) * fVar300;
    fVar255 = (fStack_260 * fVar281 +
              fStack_280 * fVar321 + fVar254 * fVar283 + fStack_300 * fVar312) * fVar300;
    fVar258 = (fStack_25c * fVar286 +
              fStack_27c * fVar211 + fVar254 * fVar294 + fStack_2fc * fVar314) * fVar300;
    fVar278 = (fVar158 * fVar214 + local_298 * fVar316 + fVar257 * fVar182 + local_2d8 * fVar303) *
              fVar300;
    fVar282 = (fVar158 * fVar277 + fStack_294 * fVar319 + fVar257 * fVar276 + fStack_2d4 * fVar310)
              * fVar300;
    fVar285 = (fVar158 * fVar281 + fStack_290 * fVar321 + fVar257 * fVar283 + fStack_2d0 * fVar312)
              * fVar300;
    fVar287 = (fVar158 * fVar286 + fStack_28c * fVar211 + fVar257 * fVar294 + fStack_2cc * fVar314)
              * fVar300;
    fVar289 = (local_278 * fVar214 + local_2a8 * fVar316 + fVar262 * fVar182 + local_2e8 * fVar303)
              * fVar300;
    fVar295 = (fStack_274 * fVar277 +
              fStack_2a4 * fVar319 + fVar262 * fVar276 + fStack_2e4 * fVar310) * fVar300;
    fVar298 = (fStack_270 * fVar281 +
              fStack_2a0 * fVar321 + fVar262 * fVar283 + fStack_2e0 * fVar312) * fVar300;
    fVar301 = (fStack_26c * fVar286 +
              fStack_29c * fVar211 + fVar262 * fVar294 + fStack_2dc * fVar314) * fVar300;
    fVar276 = fVar300 * (fVar277 * fVar210 +
                        fVar319 * fStack_2b4 + fVar276 * fStack_2c4 + fVar310 * fStack_2f4);
    fVar283 = fVar300 * (fVar281 * fVar210 +
                        fVar321 * fStack_2b0 + fVar283 * fStack_2c0 + fVar312 * fStack_2f0);
    fVar294 = fVar300 * (fVar286 * fVar210 +
                        fVar211 * fStack_2ac + fVar294 * fStack_2bc + fVar314 * fStack_2ec);
    auVar19._4_4_ = fVar272;
    auVar19._0_4_ = fVar263;
    auVar19._8_4_ = fVar274;
    auVar19._12_4_ = fVar275;
    auVar230._0_12_ = auVar19._4_12_;
    auVar230._12_4_ = 0;
    fVar334 = fVar263 + fVar300 * (fVar214 * fVar210 +
                                  fVar316 * local_2b8 + fVar182 * local_2c8 + fVar303 * local_2f8);
    fVar337 = fVar272 + fVar276;
    fVar340 = fVar274 + fVar283;
    fVar343 = fVar275 + fVar294;
    auVar248._0_8_ = CONCAT44(fVar274 - fVar283,fVar272 - fVar276);
    auVar248._8_4_ = fVar275 - fVar294;
    auVar248._12_4_ = 0;
    local_358._0_4_ = fVar280 - fVar229;
    local_358._4_4_ = fVar288 - fVar280;
    fStack_350 = fVar297 - fVar288;
    fStack_34c = 0.0 - fVar297;
    local_368._0_4_ = fVar311 - fVar304;
    local_368._4_4_ = fVar313 - fVar311;
    fStack_360 = fVar315 - fVar313;
    fStack_35c = 0.0 - fVar315;
    fVar211 = fVar278 * (float)local_368._0_4_ - fVar289 * (float)local_358._0_4_;
    fVar213 = fVar282 * (float)local_368._4_4_ - fVar295 * (float)local_358._4_4_;
    fVar214 = fVar285 * fStack_360 - fVar298 * fStack_350;
    fVar215 = fVar287 * fStack_35c - fVar301 * fStack_34c;
    local_378 = fVar336 - fVar333;
    fStack_374 = fVar339 - fVar336;
    fStack_370 = fVar342 - fVar339;
    fStack_36c = 0.0 - fVar342;
    fVar300 = fVar289 * local_378 - fVar216 * (float)local_368._0_4_;
    fVar310 = fVar295 * fStack_374 - fVar242 * (float)local_368._4_4_;
    fVar314 = fVar298 * fStack_370 - fVar255 * fStack_360;
    fVar319 = fVar301 * fStack_36c - fVar258 * fStack_35c;
    fVar277 = fVar216 * (float)local_358._0_4_ - fVar278 * local_378;
    fVar281 = fVar242 * (float)local_358._4_4_ - fVar282 * fStack_374;
    fVar260 = fVar255 * fStack_350 - fVar285 * fStack_370;
    fVar284 = fVar258 * fStack_34c - fVar287 * fStack_36c;
    auVar128._0_4_ = (float)local_368._0_4_ * (float)local_368._0_4_;
    auVar128._4_4_ = (float)local_368._4_4_ * (float)local_368._4_4_;
    auVar128._8_4_ = fStack_360 * fStack_360;
    auVar128._12_4_ = fStack_35c * fStack_35c;
    auVar266._0_4_ =
         local_378 * local_378 + (float)local_358._0_4_ * (float)local_358._0_4_ + auVar128._0_4_;
    auVar266._4_4_ =
         fStack_374 * fStack_374 + (float)local_358._4_4_ * (float)local_358._4_4_ + auVar128._4_4_;
    auVar266._8_4_ = fStack_370 * fStack_370 + fStack_350 * fStack_350 + auVar128._8_4_;
    auVar266._12_4_ = fStack_36c * fStack_36c + fStack_34c * fStack_34c + auVar128._12_4_;
    auVar82 = rcpps(auVar128,auVar266);
    fVar182 = auVar82._0_4_;
    fVar276 = auVar82._4_4_;
    fVar283 = auVar82._8_4_;
    fVar294 = auVar82._12_4_;
    fVar182 = (1.0 - fVar182 * auVar266._0_4_) * fVar182 + fVar182;
    fVar276 = (1.0 - fVar276 * auVar266._4_4_) * fVar276 + fVar276;
    fVar283 = (1.0 - fVar283 * auVar266._8_4_) * fVar283 + fVar283;
    fVar294 = (1.0 - fVar294 * auVar266._12_4_) * fVar294 + fVar294;
    fVar303 = (float)local_368._0_4_ * fVar282 - (float)local_358._0_4_ * fVar295;
    fVar312 = (float)local_368._4_4_ * fVar285 - (float)local_358._4_4_ * fVar298;
    fVar316 = fStack_360 * fVar287 - fStack_350 * fVar301;
    fVar321 = fStack_35c * 0.0 - fStack_34c * 0.0;
    fVar286 = local_378 * fVar295 - (float)local_368._0_4_ * fVar242;
    fVar296 = fStack_374 * fVar298 - (float)local_368._4_4_ * fVar255;
    fVar299 = fStack_370 * fVar301 - fStack_360 * fVar258;
    fVar302 = fStack_36c * 0.0 - fStack_35c * 0.0;
    fVar317 = (float)local_358._0_4_ * fVar242 - local_378 * fVar282;
    fVar320 = (float)local_358._4_4_ * fVar255 - fStack_374 * fVar285;
    fVar322 = fStack_350 * fVar258 - fStack_370 * fVar287;
    fVar323 = fStack_34c * 0.0 - fStack_36c * 0.0;
    auVar177._0_4_ = (fVar211 * fVar211 + fVar300 * fVar300 + fVar277 * fVar277) * fVar182;
    auVar177._4_4_ = (fVar213 * fVar213 + fVar310 * fVar310 + fVar281 * fVar281) * fVar276;
    auVar177._8_4_ = (fVar214 * fVar214 + fVar314 * fVar314 + fVar260 * fVar260) * fVar283;
    auVar177._12_4_ = (fVar215 * fVar215 + fVar319 * fVar319 + fVar284 * fVar284) * fVar294;
    auVar146._0_4_ = (fVar303 * fVar303 + fVar286 * fVar286 + fVar317 * fVar317) * fVar182;
    auVar146._4_4_ = (fVar312 * fVar312 + fVar296 * fVar296 + fVar320 * fVar320) * fVar276;
    auVar146._8_4_ = (fVar316 * fVar316 + fVar299 * fVar299 + fVar322 * fVar322) * fVar283;
    auVar146._12_4_ = (fVar321 * fVar321 + fVar302 * fVar302 + fVar323 * fVar323) * fVar294;
    auVar265 = maxps(auVar177,auVar146);
    auVar20._4_4_ = fVar272;
    auVar20._0_4_ = fVar263;
    auVar20._8_4_ = fVar274;
    auVar20._12_4_ = fVar275;
    auVar15._4_4_ = fVar337;
    auVar15._0_4_ = fVar334;
    auVar15._8_4_ = fVar340;
    auVar15._12_4_ = fVar343;
    auVar220 = maxps(auVar20,auVar15);
    auVar147._8_4_ = auVar248._8_4_;
    auVar147._0_8_ = auVar248._0_8_;
    auVar147._12_4_ = 0;
    auVar82 = maxps(auVar147,auVar230);
    auVar221 = maxps(auVar220,auVar82);
    auVar16._4_4_ = fVar337;
    auVar16._0_4_ = fVar334;
    auVar16._8_4_ = fVar340;
    auVar16._12_4_ = fVar343;
    auVar220 = minps(auVar20,auVar16);
    auVar249 = minps(auVar248,auVar230);
    auVar220 = minps(auVar220,auVar249);
    auVar82 = sqrtps(auVar82,auVar265);
    auVar265 = rsqrtps(auVar82,auVar266);
    fVar182 = auVar265._0_4_;
    fVar276 = auVar265._4_4_;
    fVar283 = auVar265._8_4_;
    fVar294 = auVar265._12_4_;
    auVar291._0_4_ = fVar182 * 1.5 - fVar182 * fVar182 * auVar266._0_4_ * 0.5 * fVar182;
    auVar291._4_4_ = fVar276 * 1.5 - fVar276 * fVar276 * auVar266._4_4_ * 0.5 * fVar276;
    auVar291._8_4_ = fVar283 * 1.5 - fVar283 * fVar283 * auVar266._8_4_ * 0.5 * fVar283;
    auVar291._12_4_ = fVar294 * 1.5 - fVar294 * fVar294 * auVar266._12_4_ * 0.5 * fVar294;
    fVar182 = 0.0 - fVar229;
    fVar276 = 0.0 - fVar280;
    fVar283 = 0.0 - fVar288;
    fVar294 = 0.0 - fVar297;
    fVar317 = 0.0 - fVar304;
    fVar322 = 0.0 - fVar311;
    fVar334 = 0.0 - fVar313;
    fVar340 = 0.0 - fVar315;
    fVar277 = 0.0 - fVar333;
    fVar260 = 0.0 - fVar336;
    fVar286 = 0.0 - fVar339;
    fVar299 = 0.0 - fVar342;
    fVar324 = local_348 * local_378 * auVar291._0_4_ +
              fVar156 * (float)local_358._0_4_ * auVar291._0_4_ +
              fVar157 * (float)local_368._0_4_ * auVar291._0_4_;
    fVar330 = fStack_344 * fStack_374 * auVar291._4_4_ +
              fVar156 * (float)local_358._4_4_ * auVar291._4_4_ +
              fVar157 * (float)local_368._4_4_ * auVar291._4_4_;
    fVar331 = fStack_340 * fStack_370 * auVar291._8_4_ +
              fVar156 * fStack_350 * auVar291._8_4_ + fVar157 * fStack_360 * auVar291._8_4_;
    fVar332 = fStack_33c * fStack_36c * auVar291._12_4_ +
              fVar156 * fStack_34c * auVar291._12_4_ + fVar157 * fStack_35c * auVar291._12_4_;
    fVar300 = local_378 * auVar291._0_4_ * fVar277 +
              (float)local_358._0_4_ * auVar291._0_4_ * fVar182 +
              (float)local_368._0_4_ * auVar291._0_4_ * fVar317;
    fVar303 = fStack_374 * auVar291._4_4_ * fVar260 +
              (float)local_358._4_4_ * auVar291._4_4_ * fVar276 +
              (float)local_368._4_4_ * auVar291._4_4_ * fVar322;
    fVar310 = fStack_370 * auVar291._8_4_ * fVar286 +
              fStack_350 * auVar291._8_4_ * fVar283 + fStack_360 * auVar291._8_4_ * fVar334;
    fVar312 = fStack_36c * auVar291._12_4_ * fVar299 +
              fStack_34c * auVar291._12_4_ * fVar294 + fStack_35c * auVar291._12_4_ * fVar340;
    fVar263 = (local_348 * fVar277 + fVar156 * fVar182 + fVar157 * fVar317) - fVar324 * fVar300;
    fVar272 = (fStack_344 * fVar260 + fVar156 * fVar276 + fVar157 * fVar322) - fVar330 * fVar303;
    fVar274 = (fStack_340 * fVar286 + fVar156 * fVar283 + fVar157 * fVar334) - fVar331 * fVar310;
    fVar275 = (fStack_33c * fVar299 + fVar156 * fVar294 + fVar157 * fVar340) - fVar332 * fVar312;
    fVar211 = (fVar277 * fVar277 + fVar182 * fVar182 + fVar317 * fVar317) - fVar300 * fVar300;
    fVar213 = (fVar260 * fVar260 + fVar276 * fVar276 + fVar322 * fVar322) - fVar303 * fVar303;
    fVar214 = (fVar286 * fVar286 + fVar283 * fVar283 + fVar334 * fVar334) - fVar310 * fVar310;
    fVar215 = (fVar299 * fVar299 + fVar294 * fVar294 + fVar340 * fVar340) - fVar312 * fVar312;
    fVar314 = (auVar221._0_4_ + auVar82._0_4_) * 1.0000002;
    fVar316 = (auVar221._4_4_ + auVar82._4_4_) * 1.0000002;
    fVar319 = (auVar221._8_4_ + auVar82._8_4_) * 1.0000002;
    fVar321 = (auVar221._12_4_ + auVar82._12_4_) * 1.0000002;
    auVar222._0_4_ = fVar314 * fVar314;
    auVar222._4_4_ = fVar316 * fVar316;
    auVar222._8_4_ = fVar319 * fVar319;
    auVar222._12_4_ = fVar321 * fVar321;
    fVar314 = fVar211 - auVar222._0_4_;
    fVar316 = fVar213 - auVar222._4_4_;
    fVar319 = fVar214 - auVar222._8_4_;
    fVar321 = fVar215 - auVar222._12_4_;
    fVar281 = fVar181 - fVar324 * fVar324;
    fVar284 = fVar217 - fVar330 * fVar330;
    fVar296 = fVar239 - fVar331 * fVar331;
    fVar302 = fVar173 - fVar332 * fVar332;
    fVar263 = fVar263 + fVar263;
    fVar272 = fVar272 + fVar272;
    fVar274 = fVar274 + fVar274;
    fVar275 = fVar275 + fVar275;
    fVar335 = fVar263 * fVar263 - fVar281 * 4.0 * fVar314;
    fVar338 = fVar272 * fVar272 - fVar284 * 4.0 * fVar316;
    fVar341 = fVar274 * fVar274 - fVar296 * 4.0 * fVar319;
    fVar344 = fVar275 * fVar275 - fVar302 * 4.0 * fVar321;
    auVar129._4_4_ = -(uint)(0.0 <= fVar338);
    auVar129._0_4_ = -(uint)(0.0 <= fVar335);
    auVar129._8_4_ = -(uint)(0.0 <= fVar341);
    auVar129._12_4_ = -(uint)(0.0 <= fVar344);
    uVar54 = (undefined4)((ulong)pSVar55 >> 0x20);
    iVar52 = movmskps((int)pSVar55,auVar129);
    auVar325._0_8_ = CONCAT44(fVar330 * fVar330,fVar324 * fVar324) & 0x7fffffff7fffffff;
    auVar325._8_4_ = ABS(fVar331 * fVar331);
    auVar325._12_4_ = ABS(fVar332 * fVar332);
    fVar320 = ABS(fVar281);
    fVar323 = ABS(fVar284);
    fVar337 = ABS(fVar296);
    fVar343 = ABS(fVar302);
    if (iVar52 == 0) {
      iVar52 = 0;
      auVar97 = _DAT_01f45a40;
      auVar250 = _DAT_01f45a30;
    }
    else {
      auVar17._4_4_ = fVar338;
      auVar17._0_4_ = fVar335;
      auVar17._8_4_ = fVar341;
      auVar17._12_4_ = fVar344;
      auVar221 = sqrtps(auVar291,auVar17);
      bVar67 = 0.0 <= fVar335;
      uVar68 = -(uint)bVar67;
      bVar12 = 0.0 <= fVar338;
      uVar69 = -(uint)bVar12;
      bVar13 = 0.0 <= fVar341;
      uVar70 = -(uint)bVar13;
      bVar14 = 0.0 <= fVar344;
      uVar71 = -(uint)bVar14;
      auVar148._0_4_ = fVar281 + fVar281;
      auVar148._4_4_ = fVar284 + fVar284;
      auVar148._8_4_ = fVar296 + fVar296;
      auVar148._12_4_ = fVar302 + fVar302;
      auVar265 = rcpps(auVar222,auVar148);
      fVar243 = auVar265._0_4_;
      fVar256 = auVar265._4_4_;
      fVar259 = auVar265._8_4_;
      fVar261 = auVar265._12_4_;
      fVar243 = (1.0 - auVar148._0_4_ * fVar243) * fVar243 + fVar243;
      fVar256 = (1.0 - auVar148._4_4_ * fVar256) * fVar256 + fVar256;
      fVar259 = (1.0 - auVar148._8_4_ * fVar259) * fVar259 + fVar259;
      fVar261 = (1.0 - auVar148._12_4_ * fVar261) * fVar261 + fVar261;
      fVar335 = (-fVar263 - auVar221._0_4_) * fVar243;
      fVar338 = (-fVar272 - auVar221._4_4_) * fVar256;
      fVar341 = (-fVar274 - auVar221._8_4_) * fVar259;
      fVar344 = (-fVar275 - auVar221._12_4_) * fVar261;
      fVar243 = (auVar221._0_4_ - fVar263) * fVar243;
      fVar256 = (auVar221._4_4_ - fVar272) * fVar256;
      fVar259 = (auVar221._8_4_ - fVar274) * fVar259;
      fVar261 = (auVar221._12_4_ - fVar275) * fVar261;
      local_1c8 = (fVar324 * fVar335 + fVar300) * auVar291._0_4_;
      fStack_1c4 = (fVar330 * fVar338 + fVar303) * auVar291._4_4_;
      fStack_1c0 = (fVar331 * fVar341 + fVar310) * auVar291._8_4_;
      fStack_1bc = (fVar332 * fVar344 + fVar312) * auVar291._12_4_;
      local_1b8 = (fVar324 * fVar243 + fVar300) * auVar291._0_4_;
      fStack_1b4 = (fVar330 * fVar256 + fVar303) * auVar291._4_4_;
      fStack_1b0 = (fVar331 * fVar259 + fVar310) * auVar291._8_4_;
      fStack_1ac = (fVar332 * fVar261 + fVar312) * auVar291._12_4_;
      auVar149._0_4_ = (uint)fVar335 & uVar68;
      auVar149._4_4_ = (uint)fVar338 & uVar69;
      auVar149._8_4_ = (uint)fVar341 & uVar70;
      auVar149._12_4_ = (uint)fVar344 & uVar71;
      auVar250._0_8_ = CONCAT44(~uVar69,~uVar68) & 0x7f8000007f800000;
      auVar250._8_4_ = ~uVar70 & 0x7f800000;
      auVar250._12_4_ = ~uVar71 & 0x7f800000;
      auVar250 = auVar250 | auVar149;
      auVar292._0_4_ = (uint)fVar243 & uVar68;
      auVar292._4_4_ = (uint)fVar256 & uVar69;
      auVar292._8_4_ = (uint)fVar259 & uVar70;
      auVar292._12_4_ = (uint)fVar261 & uVar71;
      auVar97._0_8_ = CONCAT44(~uVar69,~uVar68) & 0xff800000ff800000;
      auVar97._8_4_ = ~uVar70 & 0xff800000;
      auVar97._12_4_ = ~uVar71 & 0xff800000;
      auVar97 = auVar97 | auVar292;
      auVar30._4_4_ = fStack_314;
      auVar30._0_4_ = local_318;
      auVar30._8_4_ = fStack_310;
      auVar30._12_4_ = fStack_30c;
      auVar265 = maxps(auVar30,auVar325);
      fVar335 = auVar265._0_4_ * 1.9073486e-06;
      fVar338 = auVar265._4_4_ * 1.9073486e-06;
      fVar341 = auVar265._8_4_ * 1.9073486e-06;
      fVar344 = auVar265._12_4_ * 1.9073486e-06;
      auVar267._0_4_ = -(uint)(fVar320 < fVar335 && bVar67);
      auVar267._4_4_ = -(uint)(fVar323 < fVar338 && bVar12);
      auVar267._8_4_ = -(uint)(fVar337 < fVar341 && bVar13);
      auVar267._12_4_ = -(uint)(fVar343 < fVar344 && bVar14);
      iVar52 = movmskps(iVar52,auVar267);
      if (iVar52 != 0) {
        uVar68 = -(uint)(fVar314 <= 0.0);
        uVar69 = -(uint)(fVar316 <= 0.0);
        uVar70 = -(uint)(fVar319 <= 0.0);
        uVar71 = -(uint)(fVar321 <= 0.0);
        auVar155._0_4_ = (uVar68 & 0xff800000 | ~uVar68 & 0x7f800000) & auVar267._0_4_;
        auVar155._4_4_ = (uVar69 & 0xff800000 | ~uVar69 & 0x7f800000) & auVar267._4_4_;
        auVar155._8_4_ = (uVar70 & 0xff800000 | ~uVar70 & 0x7f800000) & auVar267._8_4_;
        auVar155._12_4_ = (uVar71 & 0xff800000 | ~uVar71 & 0x7f800000) & auVar267._12_4_;
        auVar293._0_4_ = ~auVar267._0_4_ & auVar250._0_4_;
        auVar293._4_4_ = ~auVar267._4_4_ & auVar250._4_4_;
        auVar293._8_4_ = ~auVar267._8_4_ & auVar250._8_4_;
        auVar293._12_4_ = ~auVar267._12_4_ & auVar250._12_4_;
        auVar238._0_4_ = (uVar68 & 0x7f800000 | ~uVar68 & 0xff800000) & auVar267._0_4_;
        auVar238._4_4_ = (uVar69 & 0x7f800000 | ~uVar69 & 0xff800000) & auVar267._4_4_;
        auVar238._8_4_ = (uVar70 & 0x7f800000 | ~uVar70 & 0xff800000) & auVar267._8_4_;
        auVar238._12_4_ = (uVar71 & 0x7f800000 | ~uVar71 & 0xff800000) & auVar267._12_4_;
        auVar269._0_4_ = ~auVar267._0_4_ & auVar97._0_4_;
        auVar269._4_4_ = ~auVar267._4_4_ & auVar97._4_4_;
        auVar269._8_4_ = ~auVar267._8_4_ & auVar97._8_4_;
        auVar269._12_4_ = ~auVar267._12_4_ & auVar97._12_4_;
        auVar129._4_4_ = -(uint)((fVar338 <= fVar323 || fVar316 <= 0.0) && bVar12);
        auVar129._0_4_ = -(uint)((fVar335 <= fVar320 || fVar314 <= 0.0) && bVar67);
        auVar129._8_4_ = -(uint)((fVar341 <= fVar337 || fVar319 <= 0.0) && bVar13);
        auVar129._12_4_ = -(uint)((fVar344 <= fVar343 || fVar321 <= 0.0) && bVar14);
        auVar97 = auVar269 | auVar238;
        auVar250 = auVar293 | auVar155;
      }
    }
    auVar130._0_4_ = (auVar129._0_4_ << 0x1f) >> 0x1f;
    auVar130._4_4_ = (auVar129._4_4_ << 0x1f) >> 0x1f;
    auVar130._8_4_ = (auVar129._8_4_ << 0x1f) >> 0x1f;
    auVar130._12_4_ = (auVar129._12_4_ << 0x1f) >> 0x1f;
    auVar130 = auVar130 & auVar127;
    iVar52 = movmskps(iVar52,auVar130);
    if (iVar52 == 0) {
LAB_002f8842:
      uVar64 = CONCAT44(uVar54,iVar52);
    }
    else {
      auVar223._0_4_ = (ray->org).field_0.m128[3] - (float)local_338._0_4_;
      auVar223._4_4_ = auVar223._0_4_;
      auVar223._8_4_ = auVar223._0_4_;
      auVar223._12_4_ = auVar223._0_4_;
      auVar221 = maxps(auVar223,auVar250);
      auVar231._0_4_ = ray->tfar - (float)local_338._0_4_;
      auVar231._4_4_ = auVar231._0_4_;
      auVar231._8_4_ = auVar231._0_4_;
      auVar231._12_4_ = auVar231._0_4_;
      auVar249 = minps(auVar231,auVar97);
      auVar98._0_4_ = fVar278 * fVar156 + fVar289 * fVar157;
      auVar98._4_4_ = fVar282 * fVar156 + fVar295 * fVar157;
      auVar98._8_4_ = fVar285 * fVar156 + fVar298 * fVar157;
      auVar98._12_4_ = fVar287 * fVar156 + fVar301 * fVar157;
      auVar306._0_4_ = fVar216 * local_348 + auVar98._0_4_;
      auVar306._4_4_ = fVar242 * fStack_344 + auVar98._4_4_;
      auVar306._8_4_ = fVar255 * fStack_340 + auVar98._8_4_;
      auVar306._12_4_ = fVar258 * fStack_33c + auVar98._12_4_;
      auVar265 = rcpps(auVar98,auVar306);
      fVar314 = auVar265._0_4_;
      fVar316 = auVar265._4_4_;
      fVar319 = auVar265._8_4_;
      fVar321 = auVar265._12_4_;
      fVar182 = ((1.0 - auVar306._0_4_ * fVar314) * fVar314 + fVar314) *
                -(fVar277 * fVar216 + fVar182 * fVar278 + fVar317 * fVar289);
      fVar276 = ((1.0 - auVar306._4_4_ * fVar316) * fVar316 + fVar316) *
                -(fVar260 * fVar242 + fVar276 * fVar282 + fVar322 * fVar295);
      fVar283 = ((1.0 - auVar306._8_4_ * fVar319) * fVar319 + fVar319) *
                -(fVar286 * fVar255 + fVar283 * fVar285 + fVar334 * fVar298);
      fVar294 = ((1.0 - auVar306._12_4_ * fVar321) * fVar321 + fVar321) *
                -(fVar299 * fVar258 + fVar294 * fVar287 + fVar340 * fVar301);
      uVar68 = -(uint)(auVar306._0_4_ < 0.0 || ABS(auVar306._0_4_) < 1e-18);
      uVar69 = -(uint)(auVar306._4_4_ < 0.0 || ABS(auVar306._4_4_) < 1e-18);
      uVar70 = -(uint)(auVar306._8_4_ < 0.0 || ABS(auVar306._8_4_) < 1e-18);
      uVar71 = -(uint)(auVar306._12_4_ < 0.0 || ABS(auVar306._12_4_) < 1e-18);
      auVar178._0_8_ = CONCAT44(uVar69,uVar68) & 0xff800000ff800000;
      auVar178._8_4_ = uVar70 & 0xff800000;
      auVar178._12_4_ = uVar71 & 0xff800000;
      auVar99._0_4_ = ~uVar68 & (uint)fVar182;
      auVar99._4_4_ = ~uVar69 & (uint)fVar276;
      auVar99._8_4_ = ~uVar70 & (uint)fVar283;
      auVar99._12_4_ = ~uVar71 & (uint)fVar294;
      auVar221 = maxps(auVar221,auVar99 | auVar178);
      uVar68 = -(uint)(0.0 < auVar306._0_4_ || ABS(auVar306._0_4_) < 1e-18);
      uVar69 = -(uint)(0.0 < auVar306._4_4_ || ABS(auVar306._4_4_) < 1e-18);
      uVar70 = -(uint)(0.0 < auVar306._8_4_ || ABS(auVar306._8_4_) < 1e-18);
      uVar71 = -(uint)(0.0 < auVar306._12_4_ || ABS(auVar306._12_4_) < 1e-18);
      auVar100._0_8_ = CONCAT44(uVar69,uVar68) & 0x7f8000007f800000;
      auVar100._8_4_ = uVar70 & 0x7f800000;
      auVar100._12_4_ = uVar71 & 0x7f800000;
      auVar307._0_4_ = ~uVar68 & (uint)fVar182;
      auVar307._4_4_ = ~uVar69 & (uint)fVar276;
      auVar307._8_4_ = ~uVar70 & (uint)fVar283;
      auVar307._12_4_ = ~uVar71 & (uint)fVar294;
      auVar249 = minps(auVar249,auVar307 | auVar100);
      auVar150._0_4_ = (0.0 - fVar280) * -fVar282 + (0.0 - fVar311) * -fVar295;
      auVar150._4_4_ = (0.0 - fVar288) * -fVar285 + (0.0 - fVar313) * -fVar298;
      auVar150._8_4_ = (0.0 - fVar297) * -fVar287 + (0.0 - fVar315) * -fVar301;
      auVar150._12_4_ = 0x80000000;
      auVar131._0_4_ = -fVar242 * local_348 + -fVar282 * fVar156 + -fVar295 * fVar157;
      auVar131._4_4_ = -fVar255 * fStack_344 + -fVar285 * fVar156 + -fVar298 * fVar157;
      auVar131._8_4_ = -fVar258 * fStack_340 + -fVar287 * fVar156 + -fVar301 * fVar157;
      auVar131._12_4_ = fStack_33c * -0.0 + fVar156 * -0.0 + fVar157 * -0.0;
      auVar265 = rcpps(auVar150,auVar131);
      fVar182 = auVar265._0_4_;
      fVar276 = auVar265._4_4_;
      fVar283 = auVar265._8_4_;
      fVar294 = auVar265._12_4_;
      fVar182 = (((float)DAT_01f46a60 - auVar131._0_4_ * fVar182) * fVar182 + fVar182) *
                -((0.0 - fVar336) * -fVar242 + auVar150._0_4_);
      fVar276 = ((DAT_01f46a60._4_4_ - auVar131._4_4_ * fVar276) * fVar276 + fVar276) *
                -((0.0 - fVar339) * -fVar255 + auVar150._4_4_);
      fVar283 = ((DAT_01f46a60._8_4_ - auVar131._8_4_ * fVar283) * fVar283 + fVar283) *
                -((0.0 - fVar342) * -fVar258 + auVar150._8_4_);
      fVar294 = ((DAT_01f46a60._12_4_ - auVar131._12_4_ * fVar294) * fVar294 + fVar294) * 0.0;
      uVar68 = -(uint)(auVar131._0_4_ < 0.0 || ABS(auVar131._0_4_) < 1e-18);
      uVar69 = -(uint)(auVar131._4_4_ < 0.0 || ABS(auVar131._4_4_) < 1e-18);
      uVar70 = -(uint)(auVar131._8_4_ < 0.0 || ABS(auVar131._8_4_) < 1e-18);
      uVar71 = -(uint)(auVar131._12_4_ < 0.0 || ABS(auVar131._12_4_) < 1e-18);
      auVar151._0_8_ = CONCAT44(uVar69,uVar68) & 0xff800000ff800000;
      auVar151._8_4_ = uVar70 & 0xff800000;
      auVar151._12_4_ = uVar71 & 0xff800000;
      auVar101._0_4_ = ~uVar68 & (uint)fVar182;
      auVar101._4_4_ = ~uVar69 & (uint)fVar276;
      auVar101._8_4_ = ~uVar70 & (uint)fVar283;
      auVar101._12_4_ = ~uVar71 & (uint)fVar294;
      auVar265 = maxps(auVar221,auVar101 | auVar151);
      uVar68 = -(uint)(0.0 < auVar131._0_4_ || ABS(auVar131._0_4_) < 1e-18);
      uVar69 = -(uint)(0.0 < auVar131._4_4_ || ABS(auVar131._4_4_) < 1e-18);
      uVar70 = -(uint)(0.0 < auVar131._8_4_ || ABS(auVar131._8_4_) < 1e-18);
      uVar71 = -(uint)(0.0 < auVar131._12_4_ || ABS(auVar131._12_4_) < 1e-18);
      auVar268._0_8_ = CONCAT44(uVar69,uVar68) & 0x7f8000007f800000;
      auVar268._8_4_ = uVar70 & 0x7f800000;
      auVar268._12_4_ = uVar71 & 0x7f800000;
      auVar132._0_4_ = ~uVar68 & (uint)fVar182;
      auVar132._4_4_ = ~uVar69 & (uint)fVar276;
      auVar132._8_4_ = ~uVar70 & (uint)fVar283;
      auVar132._12_4_ = ~uVar71 & (uint)fVar294;
      tp1.upper.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)minps(auVar249,auVar132 | auVar268);
      fVar294 = auVar265._12_4_;
      fVar182 = auVar265._0_4_;
      fVar276 = auVar265._4_4_;
      fVar283 = auVar265._8_4_;
      local_4a8 = auVar130._0_4_;
      uStack_4a4 = auVar130._4_4_;
      uStack_4a0 = auVar130._8_4_;
      uStack_49c = auVar130._12_4_;
      auVar102._0_4_ = -(uint)(fVar182 <= tp1.upper.field_0._0_4_) & local_4a8;
      auVar102._4_4_ = -(uint)(fVar276 <= tp1.upper.field_0._4_4_) & uStack_4a4;
      auVar102._8_4_ = -(uint)(fVar283 <= tp1.upper.field_0._8_4_) & uStack_4a0;
      auVar102._12_4_ = -(uint)(fVar294 <= tp1.upper.field_0._12_4_) & uStack_49c;
      iVar52 = movmskps(iVar52,auVar102);
      if (iVar52 == 0) goto LAB_002f8842;
      auVar21._4_4_ = (auVar220._4_4_ - auVar82._4_4_) * 0.99999976;
      auVar21._0_4_ = (auVar220._0_4_ - auVar82._0_4_) * 0.99999976;
      auVar21._8_4_ = (auVar220._8_4_ - auVar82._8_4_) * 0.99999976;
      auVar21._12_4_ = (auVar220._12_4_ - auVar82._12_4_) * 0.99999976;
      auVar220 = maxps(ZEXT816(0),auVar21);
      auVar32._4_4_ = fStack_1c4;
      auVar32._0_4_ = local_1c8;
      auVar32._8_4_ = fStack_1c0;
      auVar32._12_4_ = fStack_1bc;
      auVar82 = minps(auVar32,_DAT_01f46a60);
      auVar318._0_12_ = ZEXT812(0);
      auVar318._12_4_ = 0.0;
      auVar221 = maxps(auVar82,auVar318);
      auVar33._4_4_ = fStack_1b4;
      auVar33._0_4_ = local_1b8;
      auVar33._8_4_ = fStack_1b0;
      auVar33._12_4_ = fStack_1ac;
      auVar82 = minps(auVar33,_DAT_01f46a60);
      auVar82 = maxps(auVar82,auVar318);
      local_108._0_4_ = (auVar221._0_4_ + 0.0) * 0.25 * fVar160 + fVar159;
      local_108._4_4_ = (auVar221._4_4_ + 1.0) * 0.25 * fVar160 + fVar159;
      local_108._8_4_ = (auVar221._8_4_ + 2.0) * 0.25 * fVar160 + fVar159;
      local_108._12_4_ = (auVar221._12_4_ + 3.0) * 0.25 * fVar160 + fVar159;
      local_118[0] = (auVar82._0_4_ + 0.0) * 0.25 * fVar160 + fVar159;
      local_118[1] = (auVar82._4_4_ + 1.0) * 0.25 * fVar160 + fVar159;
      local_118[2] = (auVar82._8_4_ + 2.0) * 0.25 * fVar160 + fVar159;
      local_118[3] = (auVar82._12_4_ + 3.0) * 0.25 * fVar160 + fVar159;
      auVar152._0_4_ = fVar211 - auVar220._0_4_ * auVar220._0_4_;
      auVar152._4_4_ = fVar213 - auVar220._4_4_ * auVar220._4_4_;
      auVar152._8_4_ = fVar214 - auVar220._8_4_ * auVar220._8_4_;
      auVar152._12_4_ = fVar215 - auVar220._12_4_ * auVar220._12_4_;
      auVar133._0_4_ = fVar263 * fVar263 - fVar281 * 4.0 * auVar152._0_4_;
      auVar133._4_4_ = fVar272 * fVar272 - fVar284 * 4.0 * auVar152._4_4_;
      auVar133._8_4_ = fVar274 * fVar274 - fVar296 * 4.0 * auVar152._8_4_;
      auVar133._12_4_ = fVar275 * fVar275 - fVar302 * 4.0 * auVar152._12_4_;
      auVar164._4_4_ = -(uint)(0.0 <= auVar133._4_4_);
      auVar164._0_4_ = -(uint)(0.0 <= auVar133._0_4_);
      auVar164._8_4_ = -(uint)(0.0 <= auVar133._8_4_);
      auVar164._12_4_ = -(uint)(0.0 <= auVar133._12_4_);
      iVar52 = movmskps(iVar52,auVar164);
      if (iVar52 == 0) {
        fVar229 = 0.0;
        fVar280 = 0.0;
        fVar288 = 0.0;
        fVar297 = 0.0;
        fVar300 = 0.0;
        fVar303 = 0.0;
        fVar310 = 0.0;
        fVar312 = 0.0;
        local_638 = 0.0;
        fStack_634 = 0.0;
        fStack_630 = 0.0;
        fStack_62c = 0.0;
        _local_5b8 = ZEXT816(0);
        _local_508 = ZEXT816(0);
        iVar52 = 0;
        auVar232 = _DAT_01f45a40;
        auVar251 = _DAT_01f45a30;
      }
      else {
        auVar220 = sqrtps(local_108,auVar133);
        auVar103._0_4_ = fVar281 + fVar281;
        auVar103._4_4_ = fVar284 + fVar284;
        auVar103._8_4_ = fVar296 + fVar296;
        auVar103._12_4_ = fVar302 + fVar302;
        auVar82 = rcpps(auVar152,auVar103);
        fVar160 = auVar82._0_4_;
        fVar211 = auVar82._4_4_;
        fVar213 = auVar82._8_4_;
        fVar214 = auVar82._12_4_;
        fVar160 = ((float)DAT_01f46a60 - auVar103._0_4_ * fVar160) * fVar160 + fVar160;
        fVar211 = (DAT_01f46a60._4_4_ - auVar103._4_4_ * fVar211) * fVar211 + fVar211;
        fVar213 = (DAT_01f46a60._8_4_ - auVar103._8_4_ * fVar213) * fVar213 + fVar213;
        fVar214 = (DAT_01f46a60._12_4_ - auVar103._12_4_ * fVar214) * fVar214 + fVar214;
        fVar314 = (-fVar263 - auVar220._0_4_) * fVar160;
        fVar316 = (-fVar272 - auVar220._4_4_) * fVar211;
        fVar319 = (-fVar274 - auVar220._8_4_) * fVar213;
        fVar321 = (-fVar275 - auVar220._12_4_) * fVar214;
        fVar160 = (auVar220._0_4_ - fVar263) * fVar160;
        fVar211 = (auVar220._4_4_ - fVar272) * fVar211;
        fVar213 = (auVar220._8_4_ - fVar274) * fVar213;
        fVar214 = (auVar220._12_4_ - fVar275) * fVar214;
        fVar215 = (fVar324 * fVar314 + fVar300) * auVar291._0_4_;
        fVar263 = (fVar330 * fVar316 + fVar303) * auVar291._4_4_;
        fVar216 = (fVar331 * fVar319 + fVar310) * auVar291._8_4_;
        fVar272 = (fVar332 * fVar321 + fVar312) * auVar291._12_4_;
        local_638 = local_348 * fVar314 - (local_378 * fVar215 + fVar333);
        fStack_634 = fStack_344 * fVar316 - (fStack_374 * fVar263 + fVar336);
        fStack_630 = fStack_340 * fVar319 - (fStack_370 * fVar216 + fVar339);
        fStack_62c = fStack_33c * fVar321 - (fStack_36c * fVar272 + fVar342);
        local_5b8._4_4_ = fVar156 * fVar316 - ((float)local_358._4_4_ * fVar263 + fVar280);
        local_5b8._0_4_ = fVar156 * fVar314 - ((float)local_358._0_4_ * fVar215 + fVar229);
        fStack_5b0 = fVar156 * fVar319 - (fStack_350 * fVar216 + fVar288);
        fStack_5ac = fVar156 * fVar321 - (fStack_34c * fVar272 + fVar297);
        local_508._4_4_ = fVar157 * fVar316 - (fVar263 * (float)local_368._4_4_ + fVar311);
        local_508._0_4_ = fVar157 * fVar314 - (fVar215 * (float)local_368._0_4_ + fVar304);
        fStack_500 = fVar157 * fVar319 - (fVar216 * fStack_360 + fVar313);
        fStack_4fc = fVar157 * fVar321 - (fVar272 * fStack_35c + fVar315);
        fVar300 = (fVar324 * fVar160 + fVar300) * auVar291._0_4_;
        fVar303 = (fVar330 * fVar211 + fVar303) * auVar291._4_4_;
        fVar310 = (fVar331 * fVar213 + fVar310) * auVar291._8_4_;
        fVar312 = (fVar332 * fVar214 + fVar312) * auVar291._12_4_;
        auVar318._0_8_ =
             CONCAT44(fStack_344 * fVar211 - (fStack_374 * fVar303 + fVar336),
                      local_348 * fVar160 - (local_378 * fVar300 + fVar333));
        auVar318._8_4_ = fStack_340 * fVar213 - (fStack_370 * fVar310 + fVar339);
        auVar318._12_4_ = fStack_33c * fVar214 - (fStack_36c * fVar312 + fVar342);
        fVar229 = fVar156 * fVar160 - ((float)local_358._0_4_ * fVar300 + fVar229);
        fVar280 = fVar156 * fVar211 - ((float)local_358._4_4_ * fVar303 + fVar280);
        fVar288 = fVar156 * fVar213 - (fStack_350 * fVar310 + fVar288);
        fVar297 = fVar156 * fVar214 - (fStack_34c * fVar312 + fVar297);
        bVar67 = 0.0 <= auVar133._0_4_;
        uVar68 = -(uint)bVar67;
        bVar12 = 0.0 <= auVar133._4_4_;
        uVar69 = -(uint)bVar12;
        bVar13 = 0.0 <= auVar133._8_4_;
        uVar70 = -(uint)bVar13;
        bVar14 = 0.0 <= auVar133._12_4_;
        uVar71 = -(uint)bVar14;
        fVar300 = fVar157 * fVar160 - (fVar300 * (float)local_368._0_4_ + fVar304);
        fVar303 = fVar157 * fVar211 - (fVar303 * (float)local_368._4_4_ + fVar311);
        fVar310 = fVar157 * fVar213 - (fVar310 * fStack_360 + fVar313);
        fVar312 = fVar157 * fVar214 - (fVar312 * fStack_35c + fVar315);
        auVar104._0_4_ = (uint)fVar314 & uVar68;
        auVar104._4_4_ = (uint)fVar316 & uVar69;
        auVar104._8_4_ = (uint)fVar319 & uVar70;
        auVar104._12_4_ = (uint)fVar321 & uVar71;
        auVar251._0_8_ = CONCAT44(~uVar69,~uVar68) & 0x7f8000007f800000;
        auVar251._8_4_ = ~uVar70 & 0x7f800000;
        auVar251._12_4_ = ~uVar71 & 0x7f800000;
        auVar251 = auVar251 | auVar104;
        auVar224._0_4_ = (uint)fVar160 & uVar68;
        auVar224._4_4_ = (uint)fVar211 & uVar69;
        auVar224._8_4_ = (uint)fVar213 & uVar70;
        auVar224._12_4_ = (uint)fVar214 & uVar71;
        auVar232._0_8_ = CONCAT44(~uVar69,~uVar68) & 0xff800000ff800000;
        auVar232._8_4_ = ~uVar70 & 0xff800000;
        auVar232._12_4_ = ~uVar71 & 0xff800000;
        auVar232 = auVar232 | auVar224;
        auVar31._4_4_ = fStack_314;
        auVar31._0_4_ = local_318;
        auVar31._8_4_ = fStack_310;
        auVar31._12_4_ = fStack_30c;
        auVar82 = maxps(auVar31,auVar325);
        fVar314 = auVar82._0_4_ * 1.9073486e-06;
        fVar316 = auVar82._4_4_ * 1.9073486e-06;
        fVar319 = auVar82._8_4_ * 1.9073486e-06;
        fVar321 = auVar82._12_4_ * 1.9073486e-06;
        auVar225._0_4_ = -(uint)(fVar320 < fVar314 && bVar67);
        auVar225._4_4_ = -(uint)(fVar323 < fVar316 && bVar12);
        auVar225._8_4_ = -(uint)(fVar337 < fVar319 && bVar13);
        auVar225._12_4_ = -(uint)(fVar343 < fVar321 && bVar14);
        iVar52 = movmskps(iVar52,auVar225);
        if (iVar52 != 0) {
          uVar68 = -(uint)(auVar152._0_4_ <= 0.0);
          uVar69 = -(uint)(auVar152._4_4_ <= 0.0);
          uVar70 = -(uint)(auVar152._8_4_ <= 0.0);
          uVar71 = -(uint)(auVar152._12_4_ <= 0.0);
          auVar270._0_4_ = (uVar68 & 0xff800000 | ~uVar68 & 0x7f800000) & auVar225._0_4_;
          auVar270._4_4_ = (uVar69 & 0xff800000 | ~uVar69 & 0x7f800000) & auVar225._4_4_;
          auVar270._8_4_ = (uVar70 & 0xff800000 | ~uVar70 & 0x7f800000) & auVar225._8_4_;
          auVar270._12_4_ = (uVar71 & 0xff800000 | ~uVar71 & 0x7f800000) & auVar225._12_4_;
          auVar279._0_4_ = ~auVar225._0_4_ & auVar251._0_4_;
          auVar279._4_4_ = ~auVar225._4_4_ & auVar251._4_4_;
          auVar279._8_4_ = ~auVar225._8_4_ & auVar251._8_4_;
          auVar279._12_4_ = ~auVar225._12_4_ & auVar251._12_4_;
          auVar253._0_4_ = (uVar68 & 0x7f800000 | ~uVar68 & 0xff800000) & auVar225._0_4_;
          auVar253._4_4_ = (uVar69 & 0x7f800000 | ~uVar69 & 0xff800000) & auVar225._4_4_;
          auVar253._8_4_ = (uVar70 & 0x7f800000 | ~uVar70 & 0xff800000) & auVar225._8_4_;
          auVar253._12_4_ = (uVar71 & 0x7f800000 | ~uVar71 & 0xff800000) & auVar225._12_4_;
          auVar226._0_4_ = ~auVar225._0_4_ & auVar232._0_4_;
          auVar226._4_4_ = ~auVar225._4_4_ & auVar232._4_4_;
          auVar226._8_4_ = ~auVar225._8_4_ & auVar232._8_4_;
          auVar226._12_4_ = ~auVar225._12_4_ & auVar232._12_4_;
          auVar164._4_4_ = -(uint)((fVar316 <= fVar323 || auVar152._4_4_ <= 0.0) && bVar12);
          auVar164._0_4_ = -(uint)((fVar314 <= fVar320 || auVar152._0_4_ <= 0.0) && bVar67);
          auVar164._8_4_ = -(uint)((fVar319 <= fVar337 || auVar152._8_4_ <= 0.0) && bVar13);
          auVar164._12_4_ = -(uint)((fVar321 <= fVar343 || auVar152._12_4_ <= 0.0) && bVar14);
          auVar232 = auVar226 | auVar253;
          auVar251 = auVar279 | auVar270;
        }
      }
      fVar314 = (ray->dir).field_0.m128[0];
      fVar316 = (ray->dir).field_0.m128[1];
      fVar319 = (ray->dir).field_0.m128[2];
      uVar68 = (uint)DAT_01f46710;
      uVar69 = DAT_01f46710._4_4_;
      uVar70 = DAT_01f46710._8_4_;
      uVar71 = DAT_01f46710._12_4_;
      auVar82 = minps((undefined1  [16])tp1.upper.field_0,auVar251);
      aVar252 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)maxps(auVar265,auVar232);
      tp1.lower.field_0 = aVar252;
      local_358._0_4_ = -(uint)(fVar182 <= auVar82._0_4_) & auVar102._0_4_;
      local_358._4_4_ = -(uint)(fVar276 <= auVar82._4_4_) & auVar102._4_4_;
      fStack_350 = (float)(-(uint)(fVar283 <= auVar82._8_4_) & auVar102._8_4_);
      fStack_34c = (float)(-(uint)(fVar294 <= auVar82._12_4_) & auVar102._12_4_);
      local_368 = (undefined1  [8])
                  CONCAT44(-(uint)(aVar252.v[1] <= tp1.upper.field_0._4_4_) & auVar102._4_4_,
                           -(uint)(aVar252.v[0] <= tp1.upper.field_0._0_4_) & auVar102._0_4_);
      fStack_360 = (float)(-(uint)(aVar252.v[2] <= tp1.upper.field_0._8_4_) & auVar102._8_4_);
      fStack_35c = (float)(-(uint)(aVar252.v[3] <= tp1.upper.field_0._12_4_) & auVar102._12_4_);
      auVar105._8_4_ = fStack_360;
      auVar105._0_8_ = local_368;
      auVar105._12_4_ = fStack_35c;
      iVar52 = movmskps(iVar52,auVar105 | _local_358);
      uVar64 = CONCAT44(uVar54,iVar52);
      if (iVar52 != 0) {
        local_378 = (float)local_60c;
        fStack_374 = (float)local_60c;
        fStack_370 = (float)local_60c;
        fStack_36c = (float)local_60c;
        auVar179._0_4_ =
             -(uint)((int)local_60c <
                    ((int)((-(uint)(0.3 <= (float)((uint)((float)local_508._0_4_ * fVar319 +
                                                          (float)local_5b8._0_4_ * fVar316 +
                                                         local_638 * fVar314) & uVar68)) &
                           auVar164._0_4_) << 0x1f) >> 0x1f) + 4);
        auVar179._4_4_ =
             -(uint)((int)local_60c <
                    ((int)((-(uint)(0.3 <= (float)((uint)((float)local_508._4_4_ * fVar319 +
                                                          (float)local_5b8._4_4_ * fVar316 +
                                                         fStack_634 * fVar314) & uVar69)) &
                           auVar164._4_4_) << 0x1f) >> 0x1f) + 4);
        auVar179._8_4_ =
             -(uint)((int)local_60c <
                    ((int)((-(uint)(0.3 <= (float)((uint)(fStack_500 * fVar319 +
                                                          fStack_5b0 * fVar316 +
                                                         fStack_630 * fVar314) & uVar70)) &
                           auVar164._8_4_) << 0x1f) >> 0x1f) + 4);
        auVar179._12_4_ =
             -(uint)((int)local_60c <
                    ((int)((-(uint)(0.3 <= (float)((uint)(fStack_4fc * fVar319 +
                                                          fStack_5ac * fVar316 +
                                                         fStack_62c * fVar314) & uVar71)) &
                           auVar164._12_4_) << 0x1f) >> 0x1f) + 4);
        auVar106 = ~auVar179 & _local_358;
        auVar82 = _DAT_01f46710;
        while( true ) {
          vVar51.field_0 = tp1.lower.field_0;
          local_258 = auVar106;
          uVar54 = (undefined4)(uVar64 >> 0x20);
          iVar52 = movmskps((int)uVar64,auVar106);
          lVar56 = CONCAT44(uVar54,iVar52);
          if (iVar52 == 0) break;
          auVar221 = ~auVar106 & _DAT_01f45a30 | auVar106 & auVar265;
          auVar165._4_4_ = auVar221._0_4_;
          auVar165._0_4_ = auVar221._4_4_;
          auVar165._8_4_ = auVar221._12_4_;
          auVar165._12_4_ = auVar221._8_4_;
          auVar220 = minps(auVar165,auVar221);
          auVar134._0_8_ = auVar220._8_8_;
          auVar134._8_4_ = auVar220._0_4_;
          auVar134._12_4_ = auVar220._4_4_;
          auVar220 = minps(auVar134,auVar220);
          auVar135._0_8_ =
               CONCAT44(-(uint)(auVar220._4_4_ == auVar221._4_4_) & auVar106._4_4_,
                        -(uint)(auVar220._0_4_ == auVar221._0_4_) & auVar106._0_4_);
          auVar135._8_4_ = -(uint)(auVar220._8_4_ == auVar221._8_4_) & auVar106._8_4_;
          auVar135._12_4_ = -(uint)(auVar220._12_4_ == auVar221._12_4_) & auVar106._12_4_;
          iVar52 = movmskps(iVar52,auVar135);
          if (iVar52 != 0) {
            auVar106._8_4_ = auVar135._8_4_;
            auVar106._0_8_ = auVar135._0_8_;
            auVar106._12_4_ = auVar135._12_4_;
          }
          uVar53 = movmskps(iVar52,auVar106);
          uVar63 = CONCAT44(uVar54,uVar53);
          uVar64 = 0;
          if (uVar63 != 0) {
            for (; (uVar63 >> uVar64 & 1) == 0; uVar64 = uVar64 + 1) {
            }
          }
          *(undefined4 *)(local_258 + uVar64 * 4) = 0;
          fVar321 = (ray->dir).field_0.m128[0];
          fVar160 = (ray->dir).field_0.m128[1];
          fVar211 = (ray->dir).field_0.m128[2];
          aVar50 = (ray->dir).field_0.field_1;
          auVar28._4_4_ = fVar158;
          auVar28._0_4_ = fVar240;
          auVar28._8_4_ = fVar183;
          auVar28._12_4_ = fVar210;
          auVar26._4_4_ = fVar227;
          auVar26._0_4_ = fVar212;
          auVar26._8_4_ = fVar228;
          auVar26._12_4_ = fVar241;
          auVar221 = minps(auVar28,auVar26);
          auVar249 = maxps(auVar28,auVar26);
          auVar24._4_4_ = fVar257;
          auVar24._0_4_ = fVar254;
          auVar24._8_4_ = fVar262;
          auVar24._12_4_ = fVar271;
          auVar22._4_4_ = fVar142;
          auVar22._0_4_ = fVar143;
          auVar22._8_4_ = fVar144;
          auVar22._12_4_ = fVar273;
          auVar220 = minps(auVar24,auVar22);
          auVar221 = minps(auVar221,auVar220);
          auVar220 = maxps(auVar24,auVar22);
          auVar249 = maxps(auVar249,auVar220);
          auVar204._0_4_ = auVar221._0_4_ & auVar82._0_4_;
          auVar204._4_4_ = auVar221._4_4_ & auVar82._4_4_;
          auVar204._8_4_ = auVar221._8_4_ & auVar82._8_4_;
          auVar204._12_4_ = auVar221._12_4_ & auVar82._12_4_;
          auVar107._0_4_ = auVar249._0_4_ & auVar82._0_4_;
          auVar107._4_4_ = auVar249._4_4_ & auVar82._4_4_;
          auVar107._8_4_ = auVar249._8_4_ & auVar82._8_4_;
          auVar107._12_4_ = (uint)auVar249._12_4_ & auVar82._12_4_;
          auVar220 = maxps(auVar204,auVar107);
          fVar213 = auVar220._4_4_;
          if (auVar220._4_4_ <= auVar220._0_4_) {
            fVar213 = auVar220._0_4_;
          }
          auVar205._8_8_ = auVar220._8_8_;
          auVar205._0_8_ = auVar220._8_8_;
          if (auVar220._8_4_ <= fVar213) {
            auVar205._0_4_ = fVar213;
          }
          fVar215 = auVar205._0_4_ * 1.9073486e-06;
          fVar213 = *(float *)(local_108 + uVar64 * 4);
          fVar214 = local_118[uVar64 - 8];
          for (uVar63 = 0; uVar63 != 5; uVar63 = uVar63 + 1) {
            local_628 = aVar50.x;
            fStack_624 = aVar50.y;
            fStack_620 = aVar50.z;
            aStack_61c = aVar50.field_3;
            fVar216 = SQRT(fVar211 * fVar211 + fVar160 * fVar160 + fVar321 * fVar321) *
                      1.9073486e-06 * fVar214;
            fVar242 = 1.0 - fVar213;
            fVar274 = fVar213 * 3.0;
            fVar263 = -fVar213 * fVar242 * fVar242 * 0.5;
            fVar284 = (fVar213 * fVar213 * (fVar274 + -5.0) + 2.0) * 0.5;
            fVar281 = ((fVar242 * 3.0 + -5.0) * fVar242 * fVar242 + 2.0) * 0.5;
            fVar286 = -fVar242 * fVar213 * fVar213 * 0.5;
            fVar272 = fVar263 * fVar210 + fVar284 * fVar241 + fVar281 * fVar271 + fVar286 * fVar273;
            fVar258 = (fVar213 * (fVar242 + fVar242) - fVar242 * fVar242) * 0.5;
            fVar275 = ((fVar213 + fVar213) * (fVar274 + -5.0) + fVar213 * fVar274) * 0.5;
            fVar255 = ((fVar274 + 2.0) * (fVar242 + fVar242) + fVar242 * -3.0 * fVar242) * 0.5;
            fVar242 = (fVar242 * -2.0 * fVar213 + fVar213 * fVar213) * 0.5;
            fVar278 = fVar258 * fVar240 + fVar275 * fVar212 + fVar255 * fVar254 + fVar242 * fVar143;
            fVar282 = fVar258 * fVar158 + fVar275 * fVar227 + fVar255 * fVar257 + fVar242 * fVar142;
            fVar285 = fVar258 * fVar183 + fVar275 * fVar228 + fVar255 * fVar262 + fVar242 * fVar144;
            fVar287 = fVar258 * fVar210 + fVar275 * fVar241 + fVar255 * fVar271 + fVar242 * fVar273;
            fVar255 = fVar213 * -3.0 + 2.0;
            fVar277 = fVar213 * 9.0 + -5.0;
            fVar242 = fVar213 * -9.0 + 4.0;
            fVar274 = fVar274 + -1.0;
            fVar275 = fVar255 * fVar240 + fVar277 * fVar212 + fVar242 * fVar254 + fVar274 * fVar143;
            fVar258 = fVar255 * fVar158 + fVar277 * fVar227 + fVar242 * fVar257 + fVar274 * fVar142;
            fVar255 = fVar255 * fVar183 + fVar277 * fVar228 + fVar242 * fVar262 + fVar274 * fVar144;
            fVar277 = (fVar214 * local_628 + 0.0) -
                      (fVar263 * fVar240 + fVar284 * fVar212 + fVar281 * fVar254 + fVar286 * fVar143
                      );
            fVar260 = (fVar214 * fStack_624 + 0.0) -
                      (fVar263 * fVar158 + fVar284 * fVar227 + fVar281 * fVar257 + fVar286 * fVar142
                      );
            fVar281 = (fVar214 * fStack_620 + 0.0) -
                      (fVar263 * fVar183 + fVar284 * fVar228 + fVar281 * fVar262 + fVar286 * fVar144
                      );
            fVar284 = (fVar214 * aStack_61c.w + 0.0) - fVar272;
            fVar263 = fVar260 * fVar260;
            fVar242 = fVar281 * fVar281;
            fVar274 = fVar284 * fVar284;
            auVar308._0_4_ = fVar263 + fVar277 * fVar277 + fVar242;
            auVar308._4_4_ = fVar263 + fVar263 + fVar274;
            auVar308._8_4_ = fVar263 + fVar242 + fVar242;
            auVar308._12_4_ = fVar263 + fVar274 + fVar274;
            fVar263 = fVar215;
            if (fVar215 <= fVar216) {
              fVar263 = fVar216;
            }
            fVar242 = fVar282 * fVar282 + fVar278 * fVar278 + fVar285 * fVar285;
            auVar220 = ZEXT416((uint)fVar242);
            auVar82 = rsqrtss(ZEXT416((uint)fVar242),auVar220);
            fVar216 = auVar82._0_4_;
            fVar274 = fVar216 * 1.5 - fVar216 * fVar216 * fVar242 * 0.5 * fVar216;
            fVar298 = fVar278 * fVar274;
            fVar299 = fVar282 * fVar274;
            fVar301 = fVar285 * fVar274;
            fVar302 = fVar287 * fVar274;
            fVar296 = fVar255 * fVar285 + fVar258 * fVar282 + fVar275 * fVar278;
            auVar82 = rcpss(auVar220,auVar220);
            fVar216 = (2.0 - fVar242 * auVar82._0_4_) * auVar82._0_4_;
            fVar286 = fVar260 * fVar299;
            fVar289 = fVar281 * fVar301;
            fVar295 = fVar284 * fVar302;
            fVar311 = fVar286 + fVar277 * fVar298 + fVar289;
            fVar313 = fVar286 + fVar286 + fVar295;
            fVar289 = fVar286 + fVar289 + fVar289;
            fVar295 = fVar286 + fVar295 + fVar295;
            fVar286 = (SQRT(auVar308._0_4_) + 1.0) * (fVar215 / SQRT(fVar242)) +
                      SQRT(auVar308._0_4_) * fVar215 + fVar263;
            fVar304 = fVar302 * -fVar287;
            fVar255 = fVar301 * -fVar285 + fVar299 * -fVar282 + fVar298 * -fVar278 +
                      fVar216 * (fVar242 * fVar255 - fVar296 * fVar285) * fVar274 * fVar281 +
                      fVar216 * (fVar242 * fVar258 - fVar296 * fVar282) * fVar274 * fVar260 +
                      fVar216 * (fVar242 * fVar275 - fVar296 * fVar278) * fVar274 * fVar277;
            fVar274 = fStack_620 * fVar301 + fStack_624 * fVar299 + local_628 * fVar298;
            fVar216 = auVar308._0_4_ - fVar311 * fVar311;
            auVar108._0_8_ = CONCAT44(auVar308._4_4_ - fVar313 * fVar313,fVar216);
            auVar108._8_4_ = auVar308._8_4_ - fVar289 * fVar289;
            auVar108._12_4_ = auVar308._12_4_ - fVar295 * fVar295;
            fVar275 = -fVar287 * fVar284;
            auVar136._8_4_ = auVar108._8_4_;
            auVar136._0_8_ = auVar108._0_8_;
            auVar136._12_4_ = auVar108._12_4_;
            auVar82 = rsqrtss(auVar136,auVar108);
            fVar242 = auVar82._0_4_;
            fVar242 = fVar242 * 1.5 - fVar242 * fVar242 * fVar216 * 0.5 * fVar242;
            if (fVar216 < 0.0) {
              fVar216 = sqrtf(fVar216);
              uVar64 = extraout_RAX;
              pRVar61 = extraout_RDX;
            }
            else {
              fVar216 = SQRT(fVar216);
            }
            auVar82 = _DAT_01f46710;
            fVar216 = fVar216 - fVar272;
            fVar272 = ((-fVar285 * fVar281 + -fVar282 * fVar260 + -fVar278 * fVar277) -
                      fVar311 * fVar255) * fVar242 - fVar287;
            fVar242 = ((fStack_620 * fVar281 + fStack_624 * fVar260 + local_628 * fVar277) -
                      fVar311 * fVar274) * fVar242;
            auVar327._0_8_ = CONCAT44(fVar275,fVar272) ^ 0x8000000080000000;
            auVar207._4_4_ = fVar304;
            auVar207._0_4_ = fVar255;
            auVar166._0_4_ = fVar255 * fVar242 - fVar274 * fVar272;
            auVar327._8_4_ = -fVar275;
            auVar327._12_4_ = aStack_61c.w * fVar284;
            auVar326._8_8_ = auVar327._8_8_;
            auVar326._0_8_ = CONCAT44(fVar242,fVar272) ^ 0x80000000;
            auVar166._4_4_ = auVar166._0_4_;
            auVar166._8_4_ = auVar166._0_4_;
            auVar166._12_4_ = auVar166._0_4_;
            auVar221 = divps(auVar326,auVar166);
            auVar207._8_4_ = fVar304;
            auVar207._12_4_ = -(aStack_61c.w * fVar302);
            auVar206._8_8_ = auVar207._8_8_;
            auVar206._0_8_ = CONCAT44(fVar274,fVar255) ^ 0x8000000000000000;
            auVar220 = divps(auVar206,auVar166);
            fVar214 = fVar214 - (fVar216 * auVar220._0_4_ + fVar311 * auVar221._0_4_);
            fVar213 = fVar213 - (fVar216 * auVar220._4_4_ + fVar311 * auVar221._4_4_);
            if (((float)((uint)fVar311 & (uint)DAT_01f46710) < fVar286) &&
               ((float)((uint)fVar216 & (uint)DAT_01f46710) <
                auVar249._12_4_ * 1.9073486e-06 + fVar263 + fVar286)) {
              bVar67 = uVar63 < 5;
              fVar214 = local_338._0_4_ + fVar214;
              uVar64 = 0;
              if (((ray->org).field_0.m128[3] <= fVar214) &&
                 (((fVar321 = ray->tfar, fVar214 <= fVar321 && (uVar64 = 0, 0.0 <= fVar213)) &&
                  (fVar213 <= 1.0)))) {
                auVar220 = rsqrtss(auVar308,auVar308);
                fVar160 = auVar220._0_4_;
                pGVar9 = (context->scene->geometries).items[(long)pRVar59].ptr;
                if ((pGVar9->mask & ray->mask) == 0) {
                  uVar64 = 0;
                  pRVar61 = pRVar59;
                }
                else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                        (uVar64 = CONCAT71((int7)((ulong)context->args >> 8),1), pRVar61 = pRVar59,
                        pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  fVar160 = fVar160 * 1.5 + fVar160 * fVar160 * auVar308._0_4_ * -0.5 * fVar160;
                  fVar277 = fVar277 * fVar160;
                  fVar260 = fVar260 * fVar160;
                  fVar281 = fVar281 * fVar160;
                  fVar160 = fVar287 * fVar277 + fVar278;
                  fVar211 = fVar287 * fVar260 + fVar282;
                  fVar215 = fVar287 * fVar281 + fVar285;
                  fVar263 = fVar260 * fVar278 - fVar282 * fVar277;
                  fVar216 = fVar281 * fVar282 - fVar285 * fVar260;
                  fVar272 = fVar277 * fVar285 - fVar278 * fVar281;
                  vu0.field_0._0_8_ =
                       CONCAT44(fVar160 * fVar263 - fVar216 * fVar215,
                                fVar215 * fVar272 - fVar263 * fVar211);
                  vu0.field_0.v[2] = fVar211 * fVar216 - fVar272 * fVar160;
                  vu0.field_0.v[3] = fVar213;
                  ray->tfar = fVar214;
                  local_388._0_4_ = 0xffffffff;
                  args.geometryUserPtr = pGVar9->userPtr;
                  args.valid = (int *)local_388;
                  args.context = context->user;
                  args.hit = (RTCHitN *)&vu0;
                  args.N = 1;
                  pRVar61 = context;
                  args.ray = (RTCRayN *)ray;
                  if (pGVar9->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_002f9389:
                    p_Var57 = context->args->filter;
                    if ((p_Var57 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var57)(&args);
                      p_Var57 = (RTCFilterFunctionN)args.valid;
                      pRVar61 = extraout_RDX_01;
                      auVar82 = _DAT_01f46710;
                      if (*args.valid == 0) goto LAB_002f93e7;
                    }
                    uVar64 = CONCAT71((int7)((ulong)p_Var57 >> 8),1);
                  }
                  else {
                    (*pGVar9->occlusionFilterN)(&args);
                    pRVar61 = extraout_RDX_00;
                    auVar82 = _DAT_01f46710;
                    if (*args.valid != 0) goto LAB_002f9389;
LAB_002f93e7:
                    auVar82 = _DAT_01f46710;
                    ray->tfar = fVar321;
                    uVar64 = 0;
                  }
                }
              }
              goto LAB_002f9142;
            }
          }
          bVar67 = false;
LAB_002f9142:
          bVar62 = bVar62 | bVar67 & (byte)uVar64;
          fVar321 = ray->tfar;
          auVar106._0_4_ = -(uint)(fVar172 + fVar182 <= fVar321) & local_258._0_4_;
          auVar106._4_4_ = -(uint)(fVar172 + fVar276 <= fVar321) & local_258._4_4_;
          auVar106._8_4_ = -(uint)(fVar172 + fVar283 <= fVar321) & local_258._8_4_;
          auVar106._12_4_ = -(uint)(fVar172 + fVar294 <= fVar321) & local_258._12_4_;
        }
        fVar321 = ray->tfar;
        auVar167._0_4_ = -(uint)(aVar252.v[0] + fVar172 <= fVar321) & local_368._0_4_;
        auVar167._4_4_ = -(uint)(aVar252.v[1] + fVar172 <= fVar321) & local_368._4_4_;
        auVar167._8_4_ = -(uint)(aVar252.v[2] + fVar172 <= fVar321) & (uint)fStack_360;
        auVar167._12_4_ = -(uint)(aVar252.v[3] + fVar172 <= fVar321) & (uint)fStack_35c;
        auVar137._0_4_ =
             -(uint)((int)local_378 <
                    ((int)((-(uint)(0.3 <= (float)((uint)(auVar318._0_4_ * fVar314 +
                                                         fVar229 * fVar316 + fVar300 * fVar319) &
                                                  uVar68)) & auVar164._0_4_) << 0x1f) >> 0x1f) + 4);
        auVar137._4_4_ =
             -(uint)((int)fStack_374 <
                    ((int)((-(uint)(0.3 <= (float)((uint)(auVar318._4_4_ * fVar314 +
                                                         fVar280 * fVar316 + fVar303 * fVar319) &
                                                  uVar69)) & auVar164._4_4_) << 0x1f) >> 0x1f) + 4);
        auVar137._8_4_ =
             -(uint)((int)fStack_370 <
                    ((int)((-(uint)(0.3 <= (float)((uint)(auVar318._8_4_ * fVar314 +
                                                         fVar288 * fVar316 + fVar310 * fVar319) &
                                                  uVar70)) & auVar164._8_4_) << 0x1f) >> 0x1f) + 4);
        auVar137._12_4_ =
             -(uint)((int)fStack_36c <
                    ((int)((-(uint)(0.3 <= (float)((uint)(auVar318._12_4_ * fVar314 +
                                                         fVar297 * fVar316 + fVar312 * fVar319) &
                                                  uVar71)) & auVar164._12_4_) << 0x1f) >> 0x1f) + 4)
        ;
        auVar138 = ~auVar137 & auVar167;
        fVar229 = fVar172 + tp1.lower.field_0.v[0];
        fVar280 = fVar172 + tp1.lower.field_0.v[1];
        fVar288 = fVar172 + tp1.lower.field_0.v[2];
        fVar297 = fVar172 + tp1.lower.field_0.v[3];
        while( true ) {
          local_388 = auVar138;
          iVar52 = movmskps((int)lVar56,auVar138);
          if (iVar52 == 0) break;
          auVar220 = ~auVar138 & _DAT_01f45a30 | auVar138 & (undefined1  [16])vVar51.field_0;
          auVar168._4_4_ = auVar220._0_4_;
          auVar168._0_4_ = auVar220._4_4_;
          auVar168._8_4_ = auVar220._12_4_;
          auVar168._12_4_ = auVar220._8_4_;
          auVar265 = minps(auVar168,auVar220);
          auVar109._0_8_ = auVar265._8_8_;
          auVar109._8_4_ = auVar265._0_4_;
          auVar109._12_4_ = auVar265._4_4_;
          auVar265 = minps(auVar109,auVar265);
          auVar110._0_8_ =
               CONCAT44(-(uint)(auVar265._4_4_ == auVar220._4_4_) & auVar138._4_4_,
                        -(uint)(auVar265._0_4_ == auVar220._0_4_) & auVar138._0_4_);
          auVar110._8_4_ = -(uint)(auVar265._8_4_ == auVar220._8_4_) & auVar138._8_4_;
          auVar110._12_4_ = -(uint)(auVar265._12_4_ == auVar220._12_4_) & auVar138._12_4_;
          iVar52 = movmskps(iVar52,auVar110);
          if (iVar52 != 0) {
            auVar138._8_4_ = auVar110._8_4_;
            auVar138._0_8_ = auVar110._0_8_;
            auVar138._12_4_ = auVar110._12_4_;
          }
          uVar54 = movmskps(iVar52,auVar138);
          uVar64 = CONCAT44((int)((ulong)lVar56 >> 0x20),uVar54);
          lVar56 = 0;
          if (uVar64 != 0) {
            for (; (uVar64 >> lVar56 & 1) == 0; lVar56 = lVar56 + 1) {
            }
          }
          *(undefined4 *)(local_388 + lVar56 * 4) = 0;
          fVar300 = (ray->dir).field_0.m128[0];
          fVar303 = (ray->dir).field_0.m128[1];
          fVar310 = (ray->dir).field_0.m128[2];
          aVar50 = (ray->dir).field_0.field_1;
          auVar29._4_4_ = fVar158;
          auVar29._0_4_ = fVar240;
          auVar29._8_4_ = fVar183;
          auVar29._12_4_ = fVar210;
          auVar27._4_4_ = fVar227;
          auVar27._0_4_ = fVar212;
          auVar27._8_4_ = fVar228;
          auVar27._12_4_ = fVar241;
          auVar220 = minps(auVar29,auVar27);
          auVar221 = maxps(auVar29,auVar27);
          auVar25._4_4_ = fVar257;
          auVar25._0_4_ = fVar254;
          auVar25._8_4_ = fVar262;
          auVar25._12_4_ = fVar271;
          auVar23._4_4_ = fVar142;
          auVar23._0_4_ = fVar143;
          auVar23._8_4_ = fVar144;
          auVar23._12_4_ = fVar273;
          auVar265 = minps(auVar25,auVar23);
          auVar220 = minps(auVar220,auVar265);
          auVar265 = maxps(auVar25,auVar23);
          auVar221 = maxps(auVar221,auVar265);
          auVar208._0_4_ = auVar220._0_4_ & auVar82._0_4_;
          auVar208._4_4_ = auVar220._4_4_ & auVar82._4_4_;
          auVar208._8_4_ = auVar220._8_4_ & auVar82._8_4_;
          auVar208._12_4_ = auVar220._12_4_ & auVar82._12_4_;
          auVar111._0_4_ = auVar221._0_4_ & auVar82._0_4_;
          auVar111._4_4_ = auVar221._4_4_ & auVar82._4_4_;
          auVar111._8_4_ = auVar221._8_4_ & auVar82._8_4_;
          auVar111._12_4_ = (uint)auVar221._12_4_ & auVar82._12_4_;
          auVar265 = maxps(auVar208,auVar111);
          fVar312 = auVar265._4_4_;
          if (auVar265._4_4_ <= auVar265._0_4_) {
            fVar312 = auVar265._0_4_;
          }
          auVar209._8_8_ = auVar265._8_8_;
          auVar209._0_8_ = auVar265._8_8_;
          if (auVar265._8_4_ <= fVar312) {
            auVar209._0_4_ = fVar312;
          }
          fVar316 = auVar209._0_4_ * 1.9073486e-06;
          fVar312 = local_118[lVar56];
          fVar314 = tp1.upper.field_0.v[lVar56];
          for (uVar64 = 0; uVar64 != 5; uVar64 = uVar64 + 1) {
            local_628 = aVar50.x;
            fStack_624 = aVar50.y;
            fStack_620 = aVar50.z;
            aStack_61c = aVar50.field_3;
            fVar321 = SQRT(fVar310 * fVar310 + fVar303 * fVar303 + fVar300 * fVar300) *
                      1.9073486e-06 * fVar314;
            fVar211 = 1.0 - fVar312;
            fVar213 = fVar312 * 3.0;
            fVar319 = -fVar312 * fVar211 * fVar211 * 0.5;
            fVar274 = (fVar312 * fVar312 * (fVar213 + -5.0) + 2.0) * 0.5;
            fVar272 = ((fVar211 * 3.0 + -5.0) * fVar211 * fVar211 + 2.0) * 0.5;
            fVar255 = -fVar211 * fVar312 * fVar312 * 0.5;
            fVar160 = fVar319 * fVar210 + fVar274 * fVar241 + fVar272 * fVar271 + fVar255 * fVar273;
            fVar263 = (fVar312 * (fVar211 + fVar211) - fVar211 * fVar211) * 0.5;
            fVar215 = ((fVar312 + fVar312) * (fVar213 + -5.0) + fVar312 * fVar213) * 0.5;
            fVar214 = ((fVar213 + 2.0) * (fVar211 + fVar211) + fVar211 * -3.0 * fVar211) * 0.5;
            fVar211 = (fVar211 * -2.0 * fVar312 + fVar312 * fVar312) * 0.5;
            fVar275 = fVar263 * fVar240 + fVar215 * fVar212 + fVar214 * fVar254 + fVar211 * fVar143;
            fVar258 = fVar263 * fVar158 + fVar215 * fVar227 + fVar214 * fVar257 + fVar211 * fVar142;
            fVar277 = fVar263 * fVar183 + fVar215 * fVar228 + fVar214 * fVar262 + fVar211 * fVar144;
            fVar281 = fVar263 * fVar210 + fVar215 * fVar241 + fVar214 * fVar271 + fVar211 * fVar273;
            fVar214 = fVar312 * -3.0 + 2.0;
            fVar216 = fVar312 * 9.0 + -5.0;
            fVar211 = fVar312 * -9.0 + 4.0;
            fVar213 = fVar213 + -1.0;
            fVar215 = fVar214 * fVar240 + fVar216 * fVar212 + fVar211 * fVar254 + fVar213 * fVar143;
            fVar263 = fVar214 * fVar158 + fVar216 * fVar227 + fVar211 * fVar257 + fVar213 * fVar142;
            fVar214 = fVar214 * fVar183 + fVar216 * fVar228 + fVar211 * fVar262 + fVar213 * fVar144;
            fVar216 = (fVar314 * local_628 + 0.0) -
                      (fVar319 * fVar240 + fVar274 * fVar212 + fVar272 * fVar254 + fVar255 * fVar143
                      );
            fVar242 = (fVar314 * fStack_624 + 0.0) -
                      (fVar319 * fVar158 + fVar274 * fVar227 + fVar272 * fVar257 + fVar255 * fVar142
                      );
            fVar272 = (fVar314 * fStack_620 + 0.0) -
                      (fVar319 * fVar183 + fVar274 * fVar228 + fVar272 * fVar262 + fVar255 * fVar144
                      );
            fVar274 = (fVar314 * aStack_61c.w + 0.0) - fVar160;
            fVar319 = fVar242 * fVar242;
            fVar211 = fVar272 * fVar272;
            fVar213 = fVar274 * fVar274;
            auVar309._0_4_ = fVar319 + fVar216 * fVar216 + fVar211;
            auVar309._4_4_ = fVar319 + fVar319 + fVar213;
            auVar309._8_4_ = fVar319 + fVar211 + fVar211;
            auVar309._12_4_ = fVar319 + fVar213 + fVar213;
            fVar319 = fVar316;
            if (fVar316 <= fVar321) {
              fVar319 = fVar321;
            }
            fVar211 = fVar258 * fVar258 + fVar275 * fVar275 + fVar277 * fVar277;
            auVar265 = ZEXT416((uint)fVar211);
            auVar82 = rsqrtss(ZEXT416((uint)fVar211),auVar265);
            fVar321 = auVar82._0_4_;
            fVar213 = fVar321 * 1.5 - fVar321 * fVar321 * fVar211 * 0.5 * fVar321;
            fVar285 = fVar275 * fVar213;
            fVar287 = fVar258 * fVar213;
            fVar289 = fVar277 * fVar213;
            fVar295 = fVar281 * fVar213;
            fVar286 = fVar214 * fVar277 + fVar263 * fVar258 + fVar215 * fVar275;
            auVar82 = rcpss(auVar265,auVar265);
            fVar321 = (2.0 - fVar211 * auVar82._0_4_) * auVar82._0_4_;
            fVar255 = fVar242 * fVar287;
            fVar260 = fVar272 * fVar289;
            fVar284 = fVar274 * fVar295;
            fVar278 = fVar255 + fVar216 * fVar285 + fVar260;
            fVar282 = fVar255 + fVar255 + fVar284;
            fVar260 = fVar255 + fVar260 + fVar260;
            fVar284 = fVar255 + fVar284 + fVar284;
            fVar255 = (SQRT(auVar309._0_4_) + 1.0) * (fVar316 / SQRT(fVar211)) +
                      SQRT(auVar309._0_4_) * fVar316 + fVar319;
            auVar233._0_4_ = fVar285 * -fVar275;
            auVar233._4_4_ = fVar287 * -fVar258;
            auVar233._8_4_ = fVar289 * -fVar277;
            auVar233._12_4_ = fVar295 * -fVar281;
            auVar234._8_8_ = auVar233._8_8_;
            auVar234._0_8_ = auVar234._8_8_;
            auVar235._4_12_ = auVar234._4_12_;
            auVar235._0_4_ =
                 auVar233._8_4_ + auVar233._4_4_ + auVar233._0_4_ +
                 fVar321 * (fVar211 * fVar214 - fVar286 * fVar277) * fVar213 * fVar272 +
                 fVar321 * (fVar211 * fVar263 - fVar286 * fVar258) * fVar213 * fVar242 +
                 fVar321 * (fVar211 * fVar215 - fVar286 * fVar275) * fVar213 * fVar216;
            auVar237._0_8_ = auVar235._0_8_;
            fVar213 = fStack_620 * fVar289 + fStack_624 * fVar287 + local_628 * fVar285;
            fVar321 = auVar309._0_4_ - fVar278 * fVar278;
            auVar112._0_8_ = CONCAT44(auVar309._4_4_ - fVar282 * fVar282,fVar321);
            auVar112._8_4_ = auVar309._8_4_ - fVar260 * fVar260;
            auVar112._12_4_ = auVar309._12_4_ - fVar284 * fVar284;
            fVar214 = -fVar281 * fVar274;
            auVar139._8_4_ = auVar112._8_4_;
            auVar139._0_8_ = auVar112._0_8_;
            auVar139._12_4_ = auVar112._12_4_;
            auVar82 = rsqrtss(auVar139,auVar112);
            fVar211 = auVar82._0_4_;
            fVar211 = fVar211 * 1.5 - fVar211 * fVar211 * fVar321 * 0.5 * fVar211;
            if (fVar321 < 0.0) {
              fVar321 = sqrtf(fVar321);
              lVar56 = extraout_RAX_00;
              pRVar61 = extraout_RDX_02;
            }
            else {
              fVar321 = SQRT(fVar321);
            }
            auVar82 = _DAT_01f46710;
            fVar321 = fVar321 - fVar160;
            fVar160 = ((-fVar277 * fVar272 + -fVar258 * fVar242 + -fVar275 * fVar216) -
                      fVar278 * auVar235._0_4_) * fVar211 - fVar281;
            fVar211 = ((fStack_620 * fVar272 + fStack_624 * fVar242 + local_628 * fVar216) -
                      fVar278 * fVar213) * fVar211;
            auVar329._0_8_ = CONCAT44(fVar214,fVar160) ^ 0x8000000080000000;
            auVar169._0_4_ = auVar235._0_4_ * fVar211 - fVar213 * fVar160;
            auVar329._8_4_ = -fVar214;
            auVar329._12_4_ = aStack_61c.w * fVar274;
            auVar328._8_8_ = auVar329._8_8_;
            auVar328._0_8_ = CONCAT44(fVar211,fVar160) ^ 0x80000000;
            auVar169._4_4_ = auVar169._0_4_;
            auVar169._8_4_ = auVar169._0_4_;
            auVar169._12_4_ = auVar169._0_4_;
            auVar220 = divps(auVar328,auVar169);
            auVar237._8_4_ = auVar233._12_4_;
            auVar237._12_4_ = -(aStack_61c.w * fVar295);
            auVar236._8_8_ = auVar237._8_8_;
            auVar236._0_8_ = CONCAT44(fVar213,auVar235._0_4_) ^ 0x8000000000000000;
            auVar265 = divps(auVar236,auVar169);
            fVar314 = fVar314 - (fVar321 * auVar265._0_4_ + fVar278 * auVar220._0_4_);
            fVar312 = fVar312 - (fVar321 * auVar265._4_4_ + fVar278 * auVar220._4_4_);
            if (((float)((uint)fVar278 & (uint)DAT_01f46710) < fVar255) &&
               ((float)((uint)fVar321 & (uint)DAT_01f46710) <
                auVar221._12_4_ * 1.9073486e-06 + fVar319 + fVar255)) {
              bVar67 = uVar64 < 5;
              fVar314 = local_338._0_4_ + fVar314;
              lVar56 = 0;
              if (((ray->org).field_0.m128[3] <= fVar314) &&
                 (fVar300 = ray->tfar, fVar314 <= fVar300)) {
                lVar56 = 0;
                if ((0.0 <= fVar312) && (lVar56 = 0, fVar312 <= 1.0)) {
                  auVar265 = rsqrtss(auVar309,auVar309);
                  fVar303 = auVar265._0_4_;
                  pGVar9 = (context->scene->geometries).items[(long)pRVar59].ptr;
                  if ((pGVar9->mask & ray->mask) == 0) {
                    lVar56 = 0;
                    pRVar61 = pRVar59;
                  }
                  else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                          (lVar56 = CONCAT71((int7)((ulong)context->args >> 8),1), pRVar61 = pRVar59
                          , pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    fVar303 = fVar303 * 1.5 + fVar303 * fVar303 * auVar309._0_4_ * -0.5 * fVar303;
                    fVar216 = fVar216 * fVar303;
                    fVar242 = fVar242 * fVar303;
                    fVar272 = fVar272 * fVar303;
                    fVar303 = fVar281 * fVar216 + fVar275;
                    fVar310 = fVar281 * fVar242 + fVar258;
                    fVar316 = fVar281 * fVar272 + fVar277;
                    fVar319 = fVar242 * fVar275 - fVar258 * fVar216;
                    fVar321 = fVar272 * fVar258 - fVar277 * fVar242;
                    fVar160 = fVar216 * fVar277 - fVar275 * fVar272;
                    vu0.field_0._0_8_ =
                         CONCAT44(fVar303 * fVar319 - fVar321 * fVar316,
                                  fVar316 * fVar160 - fVar319 * fVar310);
                    vu0.field_0.v[2] = fVar310 * fVar321 - fVar160 * fVar303;
                    vu0.field_0.v[3] = fVar312;
                    ray->tfar = fVar314;
                    local_53c = -1;
                    args.geometryUserPtr = pGVar9->userPtr;
                    args.valid = &local_53c;
                    args.context = context->user;
                    args.hit = (RTCHitN *)&vu0;
                    args.N = 1;
                    pRVar61 = context;
                    args.ray = (RTCRayN *)ray;
                    if (pGVar9->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_002f9df2:
                      p_Var57 = context->args->filter;
                      if ((p_Var57 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var57)(&args);
                        p_Var57 = (RTCFilterFunctionN)args.valid;
                        pRVar61 = extraout_RDX_04;
                        auVar82 = _DAT_01f46710;
                        if (*args.valid == 0) goto LAB_002f9e50;
                      }
                      lVar56 = CONCAT71((int7)((ulong)p_Var57 >> 8),1);
                    }
                    else {
                      (*pGVar9->occlusionFilterN)(&args);
                      pRVar61 = extraout_RDX_03;
                      auVar82 = _DAT_01f46710;
                      if (*args.valid != 0) goto LAB_002f9df2;
LAB_002f9e50:
                      auVar82 = _DAT_01f46710;
                      ray->tfar = fVar300;
                      lVar56 = 0;
                    }
                  }
                }
              }
              goto LAB_002f9bba;
            }
          }
          bVar67 = false;
LAB_002f9bba:
          bVar62 = bVar62 | bVar67 & (byte)lVar56;
          fVar321 = ray->tfar;
          auVar138._0_4_ = -(uint)(fVar229 <= fVar321) & local_388._0_4_;
          auVar138._4_4_ = -(uint)(fVar280 <= fVar321) & local_388._4_4_;
          auVar138._8_4_ = -(uint)(fVar288 <= fVar321) & local_388._8_4_;
          auVar138._12_4_ = -(uint)(fVar297 <= fVar321) & local_388._12_4_;
        }
        auVar180._0_4_ = auVar179._0_4_ & local_358._0_4_ & -(uint)(fVar172 + fVar182 <= fVar321);
        auVar180._4_4_ = auVar179._4_4_ & local_358._4_4_ & -(uint)(fVar172 + fVar276 <= fVar321);
        auVar180._8_4_ = auVar179._8_4_ & (uint)fStack_350 & -(uint)(fVar172 + fVar283 <= fVar321);
        auVar180._12_4_ = auVar179._12_4_ & (uint)fStack_34c & -(uint)(fVar172 + fVar294 <= fVar321)
        ;
        auVar113._0_4_ =
             auVar137._0_4_ & auVar167._0_4_ & -(uint)(fVar172 + tp1.lower.field_0.v[0] <= fVar321);
        auVar113._4_4_ =
             auVar137._4_4_ & auVar167._4_4_ & -(uint)(fVar172 + tp1.lower.field_0.v[1] <= fVar321);
        auVar113._8_4_ =
             auVar137._8_4_ & auVar167._8_4_ & -(uint)(fVar172 + tp1.lower.field_0.v[2] <= fVar321);
        auVar113._12_4_ =
             auVar137._12_4_ & auVar167._12_4_ &
             -(uint)(fVar172 + tp1.lower.field_0.v[3] <= fVar321);
        uVar68 = movmskps(0,auVar113 | auVar180);
        uVar64 = (ulong)uVar68;
        if (uVar68 != 0) {
          uVar64 = (long)pRVar60 * 0x30;
          stack[(long)pRVar60].valid.field_0 =
               (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)(auVar113 | auVar180);
          stack[(long)pRVar60].tlower.field_0.i[0] =
               ~auVar180._0_4_ & tp1.lower.field_0.i[0] | (uint)fVar182 & auVar180._0_4_;
          stack[(long)pRVar60].tlower.field_0.i[1] =
               ~auVar180._4_4_ & tp1.lower.field_0.i[1] | (uint)fVar276 & auVar180._4_4_;
          stack[(long)pRVar60].tlower.field_0.i[2] =
               ~auVar180._8_4_ & tp1.lower.field_0.i[2] | (uint)fVar283 & auVar180._8_4_;
          stack[(long)pRVar60].tlower.field_0.i[3] =
               ~auVar180._12_4_ & tp1.lower.field_0.i[3] | (uint)fVar294 & auVar180._12_4_;
          stack[(long)pRVar60].u0 = fVar159;
          stack[(long)pRVar60].u1 = fVar171;
          stack[(long)pRVar60].depth = local_60c + 1;
          pRVar60 = (RayQueryContext *)(ulong)((int)pRVar60 + 1);
        }
      }
    }
    fVar159 = ray->tfar;
    do {
      pRVar66 = pRVar60;
      iVar52 = (int)pRVar66;
      if (iVar52 == 0) {
        if (bVar62 != 0) goto LAB_002fa140;
        auVar115._4_4_ = -(uint)(fVar118 <= fVar159);
        auVar115._0_4_ = -(uint)(fVar73 <= fVar159);
        auVar115._8_4_ = -(uint)(fVar120 <= fVar159);
        auVar115._12_4_ = -(uint)(fVar123 <= fVar159);
        uVar68 = movmskps((int)uVar64,auVar115);
        uVar68 = (uint)uVar65 & uVar68;
        goto LAB_002f7890;
      }
      pRVar60 = (RayQueryContext *)(ulong)(iVar52 - 1U);
      uVar64 = (long)pRVar60 * 0x30;
      fVar171 = stack[(long)pRVar60].tlower.field_0.v[0];
      fVar182 = stack[(long)pRVar60].tlower.field_0.v[1];
      fVar229 = stack[(long)pRVar60].tlower.field_0.v[2];
      fVar276 = stack[(long)pRVar60].tlower.field_0.v[3];
      args.valid._0_4_ =
           -(uint)(fVar172 + fVar171 <= fVar159) & stack[(long)pRVar60].valid.field_0.i[0];
      args.valid._4_4_ =
           -(uint)(fVar172 + fVar182 <= fVar159) & stack[(long)pRVar60].valid.field_0.i[1];
      args.geometryUserPtr._0_4_ =
           -(uint)(fVar172 + fVar229 <= fVar159) & stack[(long)pRVar60].valid.field_0.i[2];
      args.geometryUserPtr._4_4_ =
           -(uint)(fVar172 + fVar276 <= fVar159) & stack[(long)pRVar60].valid.field_0.i[3];
      uVar68 = movmskps((int)pRVar61,(undefined1  [16])args._0_16_);
      pRVar61 = (RayQueryContext *)(ulong)uVar68;
    } while (uVar68 == 0);
    auVar153._0_4_ = (uint)fVar171 & (uint)args.valid;
    auVar153._4_4_ = (uint)fVar182 & args.valid._4_4_;
    auVar153._8_4_ = (uint)fVar229 & (uint)args.geometryUserPtr;
    auVar153._12_4_ = (uint)fVar276 & args.geometryUserPtr._4_4_;
    auVar170._0_8_ = CONCAT44(~args.valid._4_4_,~(uint)args.valid) & 0x7f8000007f800000;
    auVar170._8_4_ = ~(uint)args.geometryUserPtr & 0x7f800000;
    auVar170._12_4_ = ~args.geometryUserPtr._4_4_ & 0x7f800000;
    auVar170 = auVar170 | auVar153;
    auVar154._4_4_ = auVar170._0_4_;
    auVar154._0_4_ = auVar170._4_4_;
    auVar154._8_4_ = auVar170._12_4_;
    auVar154._12_4_ = auVar170._8_4_;
    auVar82 = minps(auVar154,auVar170);
    auVar140._0_8_ = auVar82._8_8_;
    auVar140._8_4_ = auVar82._0_4_;
    auVar140._12_4_ = auVar82._4_4_;
    auVar82 = minps(auVar140,auVar82);
    auVar141._0_8_ =
         CONCAT44(-(uint)(auVar82._4_4_ == auVar170._4_4_) & args.valid._4_4_,
                  -(uint)(auVar82._0_4_ == auVar170._0_4_) & (uint)args.valid);
    auVar141._8_4_ = -(uint)(auVar82._8_4_ == auVar170._8_4_) & (uint)args.geometryUserPtr;
    auVar141._12_4_ = -(uint)(auVar82._12_4_ == auVar170._12_4_) & args.geometryUserPtr._4_4_;
    iVar58 = movmskps(iVar52 - 1U,auVar141);
    auVar114 = (undefined1  [16])args._0_16_;
    if (iVar58 != 0) {
      auVar114._8_4_ = auVar141._8_4_;
      auVar114._0_8_ = auVar141._0_8_;
      auVar114._12_4_ = auVar141._12_4_;
    }
    pSVar55 = stack + (long)pRVar60;
    uVar68 = movmskps(iVar58,auVar114);
    lVar56 = 0;
    if (uVar68 != 0) {
      for (; (uVar68 >> lVar56 & 1) == 0; lVar56 = lVar56 + 1) {
      }
    }
    *(undefined4 *)(local_508 + lVar56 * 4 + -0x30) = 0;
    uVar6 = stack[(long)pRVar60].u0;
    uVar7 = stack[(long)pRVar60].u1;
    local_60c = stack[(long)pRVar60].depth;
    iVar58 = movmskps(local_60c,(undefined1  [16])args._0_16_);
    pRVar61 = (RayQueryContext *)(ulong)(iVar52 - 1);
    if (iVar58 != 0) {
      pRVar61 = pRVar66;
    }
    (pSVar55->valid).field_0 = (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)args._0_16_;
    fVar159 = (float)uVar7 - (float)uVar6;
    vu0.field_0.v[1] = fVar159 * 0.33333334 + (float)uVar6;
    vu0.field_0.v[0] = fVar159 * 0.0 + (float)uVar6;
    vu0.field_0.v[2] = fVar159 * 0.6666667 + (float)uVar6;
    vu0.field_0.v[3] = fVar159 * 1.0 + (float)uVar6;
    fVar159 = vu0.field_0.v[lVar56];
    fVar171 = *(float *)((long)&vu0.field_0 + lVar56 * 4 + 4);
    pRVar60 = pRVar61;
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));
         
          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }